

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O3

size_t ZSTD_compressBlock_doubleFast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *iEnd;
  BYTE *pBVar4;
  undefined8 *puVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  BYTE *pBVar9;
  ZSTD_matchState_t *pZVar10;
  BYTE *pBVar11;
  ulong *mEnd;
  U32 *pUVar12;
  U32 *pUVar13;
  U32 *pUVar14;
  U32 *pUVar15;
  bool bVar16;
  uint uVar17;
  undefined8 uVar18;
  char cVar19;
  char cVar20;
  long lVar21;
  ulong *puVar22;
  ulong *puVar23;
  size_t sVar24;
  byte bVar25;
  byte bVar27;
  byte bVar28;
  U32 UVar29;
  uint uVar30;
  uint uVar31;
  ulong uVar32;
  ulong *puVar33;
  long lVar34;
  uint uVar35;
  size_t _size;
  ulong uVar36;
  int *piVar37;
  ulong *puVar38;
  BYTE *pBVar39;
  ulong uVar40;
  int iVar41;
  uint uVar42;
  int *iStart;
  ulong uVar43;
  uint uVar44;
  ulong uVar45;
  uint uVar46;
  uint uVar47;
  ulong uVar48;
  ulong *puVar49;
  ulong *puVar50;
  U32 UVar51;
  uint uVar52;
  uint uVar53;
  int iVar54;
  BYTE *litEnd;
  ulong *puVar55;
  ulong *puVar56;
  uint uVar57;
  int *piVar59;
  seqDef *psVar60;
  BYTE *iend;
  BYTE *prefixLowest;
  U32 prefixLowestIndex;
  BYTE *litLimit_w;
  U32 dictHBitsL;
  BYTE *dictEnd;
  BYTE *base;
  U32 dictHBitsS;
  BYTE *dictBase;
  U32 dictIndexDelta;
  U32 *hashLong;
  BYTE *ilimit;
  BYTE *dictStart;
  U32 dictStartIndex;
  BYTE *litLimit_w_3;
  U32 *hashSmall;
  char *_ptr;
  uint local_14c;
  byte bVar26;
  ulong uVar58;
  
  pBVar9 = (ms->window).base;
  iEnd = (ulong *)((long)src + srcSize);
  iVar41 = (int)pBVar9;
  uVar35 = (int)iEnd - iVar41;
  uVar44 = (ms->window).dictLimit;
  uVar53 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar17 = uVar35 - uVar53;
  if (uVar35 - uVar44 <= uVar53) {
    uVar17 = uVar44;
  }
  if (ms->loadedDictEnd != 0) {
    uVar17 = uVar44;
  }
  pZVar10 = ms->dictMatchState;
  uVar6 = (pZVar10->window).dictLimit;
  pBVar11 = (pZVar10->window).base;
  piVar37 = (int *)(pBVar11 + uVar6);
  iStart = (int *)(pBVar9 + uVar17);
  uVar53 = uVar53 + uVar44;
  puVar22 = (ulong *)((long)src + (srcSize - 8));
  mEnd = (ulong *)(pZVar10->window).nextSrc;
  uVar57 = ((int)pBVar11 - (int)mEnd) + uVar17;
  uVar58 = (ulong)uVar57;
  pUVar12 = pZVar10->hashTable;
  pUVar13 = pZVar10->chainTable;
  uVar31 = (pZVar10->cParams).hashLog;
  uVar47 = (pZVar10->cParams).chainLog;
  uVar46 = ((int)src - ((int)piVar37 + (int)iStart)) + (int)mEnd;
  uVar52 = (ms->cParams).minMatch;
  pUVar14 = ms->hashTable;
  uVar7 = (ms->cParams).hashLog;
  pUVar15 = ms->chainTable;
  uVar8 = (ms->cParams).chainLog;
  local_14c = *rep;
  uVar42 = rep[1];
  uVar44 = uVar31 + 8;
  uVar30 = uVar47 + 8;
  bVar25 = (byte)uVar31;
  bVar26 = (byte)uVar47;
  cVar19 = (char)uVar7;
  cVar20 = (char)uVar8;
  if (uVar52 == 5) {
    if (uVar53 < uVar35) goto LAB_001ca021;
    if (ms->prefetchCDictTables != 0) {
      if (uVar31 < 0x3e) {
        uVar32 = 0;
        do {
          uVar32 = uVar32 + 0x40;
        } while (uVar32 < (ulong)(4L << (bVar25 & 0x3f)));
      }
      if (uVar47 < 0x3e) {
        uVar32 = 0;
        do {
          uVar32 = uVar32 + 0x40;
        } while (uVar32 < (ulong)(4L << (bVar26 & 0x3f)));
      }
    }
    if (uVar46 < local_14c) goto LAB_001ca040;
    puVar55 = (ulong *)((long)src + (ulong)(uVar46 == 0));
    if (uVar46 < uVar42) goto LAB_001ca05f;
    if (puVar55 < puVar22) {
      if ((((0x20 < uVar7) || (0x20 < uVar8)) || (0x20 < uVar44)) || (0x20 < uVar30))
      goto LAB_001ca002;
      bVar27 = 0x40 - cVar19;
      bVar28 = 0x40 - cVar20;
      puVar1 = (ulong *)((long)iEnd - 7);
      puVar2 = (ulong *)((long)iEnd - 3);
      puVar3 = (ulong *)((long)iEnd - 1);
      puVar23 = iEnd + -4;
      do {
        uVar32 = *puVar55;
        uVar45 = uVar32 * -0x30e44323485a9b9d >> (bVar27 & 0x3f);
        uVar48 = uVar32 * -0x30e4432345000000 >> (bVar28 & 0x3f);
        uVar43 = uVar32 * -0x30e44323485a9b9d >> (0x38 - bVar25 & 0x3f);
        uVar40 = uVar32 * -0x30e4432345000000 >> (0x38 - bVar26 & 0x3f);
        uVar44 = pUVar12[uVar43 >> 8];
        uVar35 = pUVar13[uVar40 >> 8];
        iVar54 = (int)puVar55;
        UVar51 = iVar54 - iVar41;
        uVar53 = pUVar14[uVar45];
        uVar36 = (ulong)uVar53;
        UVar29 = UVar51 + 1;
        uVar30 = UVar29 - local_14c;
        piVar59 = (int *)(pBVar9 + uVar30);
        if (uVar30 < uVar17) {
          piVar59 = (int *)(pBVar11 + (uVar30 - uVar57));
        }
        uVar31 = pUVar15[uVar48];
        pUVar15[uVar48] = UVar51;
        pUVar14[uVar45] = UVar51;
        uVar47 = local_14c;
        if (((uVar17 - 1) - uVar30 < 3) || (*piVar59 != *(int *)((long)puVar55 + 1))) {
          puVar56 = puVar55;
          if (uVar17 < uVar53) {
            puVar33 = (ulong *)(pBVar9 + uVar36);
            if (*puVar33 != uVar32) goto LAB_001c85ba;
            puVar50 = puVar55 + 1;
            puVar38 = puVar33 + 1;
            puVar49 = puVar50;
            if (puVar50 < puVar1) {
              if (*puVar38 == *puVar50) {
                lVar34 = 0;
                do {
                  puVar38 = (ulong *)((long)puVar55 + lVar34 + 0x10);
                  if (puVar1 <= puVar38) {
                    puVar38 = (ulong *)(pBVar9 + lVar34 + uVar36 + 0x10);
                    puVar49 = (ulong *)((long)puVar55 + lVar34 + 0x10);
                    goto LAB_001c89a0;
                  }
                  lVar21 = lVar34 + uVar36 + 0x10;
                  uVar32 = *puVar38;
                  lVar34 = lVar34 + 8;
                } while (*(ulong *)(pBVar9 + lVar21) == uVar32);
                uVar32 = uVar32 ^ *(ulong *)(pBVar9 + lVar21);
                uVar40 = 0;
                if (uVar32 != 0) {
                  for (; (uVar32 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                  }
                }
                uVar32 = (uVar40 >> 3 & 0x1fffffff) + lVar34;
              }
              else {
                uVar40 = *puVar50 ^ *puVar38;
                uVar32 = 0;
                if (uVar40 != 0) {
                  for (; (uVar40 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                  }
                }
                uVar32 = uVar32 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_001c89a0:
              if ((puVar49 < puVar2) && ((int)*puVar38 == (int)*puVar49)) {
                puVar49 = (ulong *)((long)puVar49 + 4);
                puVar38 = (ulong *)((long)puVar38 + 4);
              }
              if ((puVar49 < puVar3) && ((short)*puVar38 == (short)*puVar49)) {
                puVar49 = (ulong *)((long)puVar49 + 2);
                puVar38 = (ulong *)((long)puVar38 + 2);
              }
              if (puVar49 < iEnd) {
                puVar49 = (ulong *)((long)puVar49 + (ulong)((BYTE)*puVar38 == (BYTE)*puVar49));
              }
              uVar32 = (long)puVar49 - (long)puVar50;
            }
            uVar32 = uVar32 + 8;
            uVar47 = iVar54 - (int)puVar33;
            if (puVar55 <= src) goto LAB_001c8bdd;
            piVar59 = (int *)(pBVar9 + (uVar36 - 1));
            puVar56 = (ulong *)((long)puVar55 + -1);
            do {
              if ((char)*puVar56 != (char)*piVar59) goto LAB_001c8bc9;
              uVar32 = uVar32 + 1;
              puVar55 = (ulong *)((long)puVar56 + -1);
            } while ((src < puVar56) &&
                    (bVar16 = iStart < piVar59, piVar59 = (int *)((long)piVar59 + -1),
                    puVar56 = puVar55, bVar16));
            goto LAB_001c8b23;
          }
          if ((char)uVar43 == (char)uVar44) {
            uVar44 = uVar44 >> 8;
            puVar33 = (ulong *)(pBVar11 + uVar44);
            if (puVar33 < mEnd) {
              if ((uVar44 <= uVar6) || (*puVar33 != uVar32)) goto LAB_001c85ba;
              sVar24 = ZSTD_count_2segments
                                 ((BYTE *)(puVar55 + 1),(BYTE *)(puVar33 + 1),(BYTE *)iEnd,
                                  (BYTE *)mEnd,(BYTE *)iStart);
              uVar32 = sVar24 + 8;
              uVar47 = UVar51 - (uVar44 + uVar57);
              if (src < puVar55) {
                piVar59 = (int *)(pBVar11 + ((ulong)uVar44 - 1));
                puVar56 = (ulong *)((long)puVar55 + -1);
                do {
                  if ((char)*puVar56 != (char)*piVar59) goto LAB_001c8bc9;
                  uVar32 = uVar32 + 1;
                  puVar55 = (ulong *)((long)puVar56 + -1);
                } while ((src < puVar56) &&
                        (bVar16 = piVar37 < piVar59, piVar59 = (int *)((long)piVar59 + -1),
                        puVar56 = puVar55, bVar16));
                goto LAB_001c8b23;
              }
              goto LAB_001c8bdd;
            }
            goto LAB_001c9fe3;
          }
LAB_001c85ba:
          if (uVar17 < uVar31) {
            piVar59 = (int *)(pBVar9 + uVar31);
            if (*piVar59 != (int)*puVar55) goto LAB_001c86f5;
LAB_001c85de:
            uVar32 = *(ulong *)((long)puVar55 + 1);
            uVar43 = uVar32 * -0x30e44323485a9b9d >> (bVar27 & 0x3f);
            uVar40 = uVar32 * -0x30e44323485a9b9d >> (0x38 - bVar25 & 0x3f);
            puVar56 = (ulong *)((long)puVar55 + 1);
            uVar44 = pUVar14[uVar43];
            uVar36 = (ulong)uVar44;
            uVar35 = pUVar12[uVar40 >> 8];
            pUVar14[uVar43] = UVar29;
            if (uVar17 < uVar44) {
              puVar33 = (ulong *)(pBVar9 + uVar36);
              if (*puVar33 != uVar32) goto LAB_001c8843;
              puVar50 = (ulong *)((long)puVar55 + 9);
              puVar38 = puVar33 + 1;
              puVar49 = puVar50;
              if (puVar50 < puVar1) {
                if (*puVar38 == *puVar50) {
                  lVar34 = 0;
                  do {
                    puVar38 = (ulong *)((long)puVar55 + lVar34 + 0x11);
                    if (puVar1 <= puVar38) {
                      puVar38 = (ulong *)(pBVar9 + lVar34 + uVar36 + 0x10);
                      puVar49 = (ulong *)((long)puVar55 + lVar34 + 0x11);
                      goto LAB_001c8b36;
                    }
                    lVar21 = lVar34 + uVar36 + 0x10;
                    uVar32 = *puVar38;
                    lVar34 = lVar34 + 8;
                  } while (*(ulong *)(pBVar9 + lVar21) == uVar32);
                  uVar32 = uVar32 ^ *(ulong *)(pBVar9 + lVar21);
                  uVar40 = 0;
                  if (uVar32 != 0) {
                    for (; (uVar32 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                    }
                  }
                  uVar32 = (uVar40 >> 3 & 0x1fffffff) + lVar34;
                }
                else {
                  uVar40 = *puVar50 ^ *puVar38;
                  uVar32 = 0;
                  if (uVar40 != 0) {
                    for (; (uVar40 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                    }
                  }
                  uVar32 = uVar32 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_001c8b36:
                if ((puVar49 < puVar2) && ((int)*puVar38 == (int)*puVar49)) {
                  puVar49 = (ulong *)((long)puVar49 + 4);
                  puVar38 = (ulong *)((long)puVar38 + 4);
                }
                if ((puVar49 < puVar3) && ((short)*puVar38 == (short)*puVar49)) {
                  puVar49 = (ulong *)((long)puVar49 + 2);
                  puVar38 = (ulong *)((long)puVar38 + 2);
                }
                if (puVar49 < iEnd) {
                  puVar49 = (ulong *)((long)puVar49 + (ulong)((BYTE)*puVar38 == (BYTE)*puVar49));
                }
                uVar32 = (long)puVar49 - (long)puVar50;
              }
              uVar32 = uVar32 + 8;
              uVar47 = (int)puVar56 - (int)puVar33;
              if (src < puVar56) {
                piVar59 = (int *)(pBVar9 + (uVar36 - 1));
                do {
                  if ((char)*puVar55 != (char)*piVar59) goto LAB_001c8b23;
                  uVar32 = uVar32 + 1;
                  puVar56 = (ulong *)((long)puVar55 + -1);
                } while ((src < puVar55) &&
                        (bVar16 = iStart < piVar59, piVar59 = (int *)((long)piVar59 + -1),
                        puVar55 = puVar56, bVar16));
LAB_001c8bc9:
                puVar56 = (ulong *)((long)puVar56 + 1);
              }
            }
            else {
              if ((char)uVar40 == (char)uVar35) {
                uVar35 = uVar35 >> 8;
                puVar33 = (ulong *)(pBVar11 + uVar35);
                if (mEnd <= puVar33) goto LAB_001ca07e;
                if ((uVar6 < uVar35) && (*puVar33 == uVar32)) {
                  sVar24 = ZSTD_count_2segments
                                     ((BYTE *)((long)puVar55 + 9),(BYTE *)(puVar33 + 1),(BYTE *)iEnd
                                      ,(BYTE *)mEnd,(BYTE *)iStart);
                  uVar32 = sVar24 + 8;
                  uVar47 = UVar29 - (uVar57 + uVar35);
                  if (src < puVar56) {
                    piVar59 = (int *)(pBVar11 + ((ulong)uVar35 - 1));
                    do {
                      if ((char)*puVar55 != (char)*piVar59) goto LAB_001c8b23;
                      uVar32 = uVar32 + 1;
                      puVar56 = (ulong *)((long)puVar55 + -1);
                    } while ((src < puVar55) &&
                            (bVar16 = piVar37 < piVar59, piVar59 = (int *)((long)piVar59 + -1),
                            puVar55 = puVar56, bVar16));
LAB_001c8838:
                    puVar56 = (ulong *)((long)puVar56 + 1);
                  }
                  goto LAB_001c8bdd;
                }
              }
LAB_001c8843:
              puVar56 = (ulong *)((long)puVar55 + 4);
              puVar33 = (ulong *)(piVar59 + 1);
              if (uVar31 < uVar17) {
                sVar24 = ZSTD_count_2segments
                                   ((BYTE *)puVar56,(BYTE *)puVar33,(BYTE *)iEnd,(BYTE *)mEnd,
                                    (BYTE *)iStart);
                uVar32 = sVar24 + 4;
                uVar47 = UVar51 - uVar31;
                puVar56 = puVar55;
                if ((src < puVar55) && (piVar37 < piVar59)) {
                  puVar56 = (ulong *)((long)puVar55 + -1);
                  do {
                    piVar59 = (int *)((long)piVar59 + -1);
                    if ((char)*puVar56 != *(char *)piVar59) goto LAB_001c8838;
                    uVar32 = uVar32 + 1;
                    puVar55 = (ulong *)((long)puVar56 + -1);
                  } while ((src < puVar56) && (puVar56 = puVar55, piVar37 < piVar59));
LAB_001c8b23:
                  puVar56 = (ulong *)((long)puVar55 + 1);
                }
              }
              else {
                puVar50 = puVar56;
                if (puVar56 < puVar1) {
                  if (*puVar33 == *puVar56) {
                    lVar34 = 0;
                    do {
                      puVar33 = (ulong *)((long)puVar55 + lVar34 + 0xc);
                      if (puVar1 <= puVar33) {
                        puVar33 = (ulong *)((long)piVar59 + lVar34 + 0xc);
                        puVar50 = (ulong *)((long)puVar55 + lVar34 + 0xc);
                        goto LAB_001c8a82;
                      }
                      uVar32 = *(ulong *)((long)piVar59 + lVar34 + 0xc);
                      uVar36 = *puVar33;
                      lVar34 = lVar34 + 8;
                    } while (uVar32 == uVar36);
                    uVar36 = uVar36 ^ uVar32;
                    uVar32 = 0;
                    if (uVar36 != 0) {
                      for (; (uVar36 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                      }
                    }
                    uVar32 = (uVar32 >> 3 & 0x1fffffff) + lVar34;
                  }
                  else {
                    uVar36 = *puVar56 ^ *puVar33;
                    uVar32 = 0;
                    if (uVar36 != 0) {
                      for (; (uVar36 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                      }
                    }
                    uVar32 = uVar32 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_001c8a82:
                  if ((puVar50 < puVar2) && ((int)*puVar33 == (int)*puVar50)) {
                    puVar50 = (ulong *)((long)puVar50 + 4);
                    puVar33 = (ulong *)((long)puVar33 + 4);
                  }
                  if ((puVar50 < puVar3) && ((short)*puVar33 == (short)*puVar50)) {
                    puVar50 = (ulong *)((long)puVar50 + 2);
                    puVar33 = (ulong *)((long)puVar33 + 2);
                  }
                  if (puVar50 < iEnd) {
                    puVar50 = (ulong *)((long)puVar50 + (ulong)((BYTE)*puVar33 == (BYTE)*puVar50));
                  }
                  uVar32 = (long)puVar50 - (long)puVar56;
                }
                uVar32 = uVar32 + 4;
                uVar47 = iVar54 - (int)piVar59;
                puVar56 = puVar55;
                if ((src < puVar55) && (iStart < piVar59)) {
                  puVar56 = (ulong *)((long)puVar55 + -1);
                  do {
                    piVar59 = (int *)((long)piVar59 + -1);
                    if ((char)*puVar56 != *(char *)piVar59) goto LAB_001c8838;
                    uVar32 = uVar32 + 1;
                    puVar55 = (ulong *)((long)puVar56 + -1);
                  } while ((src < puVar56) && (puVar56 = puVar55, iStart < piVar59));
                  goto LAB_001c8b23;
                }
              }
            }
LAB_001c8bdd:
            if (uVar47 != 0) {
              if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                  seqStore->maxNbSeq) {
                if (seqStore->maxNbLit < 0x20001) {
                  uVar36 = (long)puVar56 - (long)src;
                  puVar55 = (ulong *)seqStore->lit;
                  if ((BYTE *)((long)puVar55 + uVar36) <= seqStore->litStart + seqStore->maxNbLit) {
                    if (puVar56 <= iEnd) {
                      if (puVar23 < puVar56) {
                        ZSTD_safecopyLiterals
                                  ((BYTE *)puVar55,(BYTE *)src,(BYTE *)puVar56,(BYTE *)puVar23);
LAB_001c8c4c:
                        seqStore->lit = seqStore->lit + uVar36;
                        if (0xffff < uVar36) {
                          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001c9fa5;
                          seqStore->longLengthType = ZSTD_llt_literalLength;
                          seqStore->longLengthPos =
                               (U32)((ulong)((long)seqStore->sequences -
                                            (long)seqStore->sequencesStart) >> 3);
                        }
                      }
                      else {
                        uVar40 = *(ulong *)((long)src + 8);
                        *puVar55 = *src;
                        puVar55[1] = uVar40;
                        pBVar39 = seqStore->lit;
                        if (0x10 < uVar36) {
                          if ((ulong)((long)(pBVar39 + 0x10) + (-0x10 - ((long)src + 0x10))) <
                              0xffffffffffffffe1) {
                            uVar40 = *(ulong *)((long)src + 0x18);
                            *(ulong *)(pBVar39 + 0x10) = *(ulong *)((long)src + 0x10);
                            *(ulong *)(pBVar39 + 0x18) = uVar40;
                            if (0x20 < (long)uVar36) {
                              lVar34 = 0;
                              do {
                                puVar5 = (undefined8 *)((long)src + lVar34 + 0x20);
                                uVar18 = puVar5[1];
                                pBVar4 = pBVar39 + lVar34 + 0x20;
                                *(undefined8 *)pBVar4 = *puVar5;
                                *(undefined8 *)(pBVar4 + 8) = uVar18;
                                puVar5 = (undefined8 *)((long)src + lVar34 + 0x30);
                                uVar18 = puVar5[1];
                                *(undefined8 *)(pBVar4 + 0x10) = *puVar5;
                                *(undefined8 *)(pBVar4 + 0x18) = uVar18;
                                lVar34 = lVar34 + 0x20;
                              } while (pBVar4 + 0x20 < pBVar39 + uVar36);
                            }
                            goto LAB_001c8c4c;
                          }
                          goto LAB_001c9fc4;
                        }
                        seqStore->lit = pBVar39 + uVar36;
                      }
                      psVar60 = seqStore->sequences;
                      psVar60->litLength = (U16)uVar36;
                      psVar60->offBase = uVar47 + 3;
                      if (2 < uVar32) {
                        uVar36 = uVar32 - 3;
                        uVar42 = local_14c;
                        if (uVar36 < 0x10000) goto LAB_001c8d4c;
                        if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_001c8d2d;
                        goto LAB_001c9f67;
                      }
                      goto LAB_001c9f0a;
                    }
                    goto LAB_001c9f48;
                  }
                  goto LAB_001c9f29;
                }
                goto LAB_001c9eeb;
              }
              goto LAB_001c9ecc;
            }
            goto LAB_001c9f86;
          }
          if ((char)uVar40 == (char)uVar35) {
            uVar35 = uVar35 >> 8;
            if ((uVar6 < uVar35) && (*(int *)(pBVar11 + uVar35) == (int)*puVar55)) {
              uVar31 = uVar35 + uVar57;
              piVar59 = (int *)(pBVar11 + uVar35);
              goto LAB_001c85de;
            }
          }
LAB_001c86f5:
          puVar55 = (ulong *)((long)puVar55 + ((long)puVar55 - (long)src >> 8) + 1);
        }
        else {
          puVar56 = iEnd;
          if (uVar30 < uVar17) {
            puVar56 = mEnd;
          }
          sVar24 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar55 + 5),(BYTE *)(piVar59 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar56,(BYTE *)iStart);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_001c9ecc;
          if (0x20000 < seqStore->maxNbLit) goto LAB_001c9eeb;
          puVar56 = (ulong *)((long)puVar55 + 1);
          uVar36 = (long)puVar56 - (long)src;
          puVar55 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar55 + uVar36))
          goto LAB_001c9f29;
          if (iEnd < puVar56) goto LAB_001c9f48;
          if (puVar23 < puVar56) {
            ZSTD_safecopyLiterals((BYTE *)puVar55,(BYTE *)src,(BYTE *)puVar56,(BYTE *)puVar23);
LAB_001c8433:
            seqStore->lit = seqStore->lit + uVar36;
            if (0xffff < uVar36) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001c9fa5;
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            uVar32 = *(ulong *)((long)src + 8);
            *puVar55 = *src;
            puVar55[1] = uVar32;
            pBVar39 = seqStore->lit;
            if (0x10 < uVar36) {
              if ((ulong)((long)(pBVar39 + 0x10) + (-0x10 - ((long)src + 0x10))) <
                  0xffffffffffffffe1) {
                uVar32 = *(ulong *)((long)src + 0x18);
                *(ulong *)(pBVar39 + 0x10) = *(ulong *)((long)src + 0x10);
                *(ulong *)(pBVar39 + 0x18) = uVar32;
                if (0x20 < (long)uVar36) {
                  lVar34 = 0;
                  do {
                    puVar5 = (undefined8 *)((long)src + lVar34 + 0x20);
                    uVar18 = puVar5[1];
                    pBVar4 = pBVar39 + lVar34 + 0x20;
                    *(undefined8 *)pBVar4 = *puVar5;
                    *(undefined8 *)(pBVar4 + 8) = uVar18;
                    puVar5 = (undefined8 *)((long)src + lVar34 + 0x30);
                    uVar18 = puVar5[1];
                    *(undefined8 *)(pBVar4 + 0x10) = *puVar5;
                    *(undefined8 *)(pBVar4 + 0x18) = uVar18;
                    lVar34 = lVar34 + 0x20;
                  } while (pBVar4 + 0x20 < pBVar39 + uVar36);
                }
                goto LAB_001c8433;
              }
              goto LAB_001c9fc4;
            }
            seqStore->lit = pBVar39 + uVar36;
          }
          uVar32 = sVar24 + 4;
          psVar60 = seqStore->sequences;
          psVar60->litLength = (U16)uVar36;
          psVar60->offBase = 1;
          if (uVar32 < 3) goto LAB_001c9f0a;
          uVar36 = sVar24 + 1;
          if (0xffff < uVar36) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001c9f67;
LAB_001c8d2d:
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar60 - (long)seqStore->sequencesStart) >> 3);
          }
LAB_001c8d4c:
          src = (void *)(uVar32 + (long)puVar56);
          psVar60->mlBase = (U16)uVar36;
          psVar60 = psVar60 + 1;
          seqStore->sequences = psVar60;
          puVar55 = (ulong *)src;
          if (src <= puVar22) {
            uVar44 = UVar51 + 2;
            lVar34 = *(long *)(pBVar9 + uVar44);
            pUVar14[(ulong)(lVar34 * -0x30e44323485a9b9d) >> (bVar27 & 0x3f)] = uVar44;
            pUVar14[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar27 & 0x3f)] =
                 ((int)src + -2) - iVar41;
            pUVar15[(ulong)(lVar34 * -0x30e4432345000000) >> (bVar28 & 0x3f)] = uVar44;
            pUVar15[(ulong)(*(long *)((long)src + -1) * -0x30e4432345000000) >> (bVar28 & 0x3f)] =
                 ((int)src + -1) - iVar41;
            uVar44 = uVar42;
            do {
              uVar53 = uVar47;
              UVar29 = (int)src - iVar41;
              uVar35 = UVar29 - uVar44;
              pBVar39 = pBVar9;
              if (uVar35 < uVar17) {
                pBVar39 = pBVar11 + -uVar58;
              }
              puVar55 = (ulong *)src;
              uVar42 = uVar44;
              uVar47 = uVar53;
              if (((uVar17 - 1) - uVar35 < 3) || (*(int *)(pBVar39 + uVar35) != (int)*src)) break;
              puVar55 = iEnd;
              if (uVar35 < uVar17) {
                puVar55 = mEnd;
              }
              sVar24 = ZSTD_count_2segments
                                 ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar39 + uVar35) + 4),
                                  (BYTE *)iEnd,(BYTE *)puVar55,(BYTE *)iStart);
              if (seqStore->maxNbSeq <= (ulong)((long)psVar60 - (long)seqStore->sequencesStart >> 3)
                 ) goto LAB_001c9ecc;
              if (0x20000 < seqStore->maxNbLit) goto LAB_001c9eeb;
              puVar55 = (ulong *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < puVar55) goto LAB_001c9f29;
              if (iEnd < src) goto LAB_001c9f48;
              if (puVar23 < src) {
                ZSTD_safecopyLiterals((BYTE *)puVar55,(BYTE *)src,(BYTE *)src,(BYTE *)puVar23);
              }
              else {
                uVar32 = *(ulong *)((long)src + 8);
                *puVar55 = *src;
                puVar55[1] = uVar32;
              }
              psVar60 = seqStore->sequences;
              psVar60->litLength = 0;
              psVar60->offBase = 1;
              if (sVar24 + 4 < 3) goto LAB_001c9f0a;
              if (0xffff < sVar24 + 1) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001c9f67;
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar60 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar60->mlBase = (U16)(sVar24 + 1);
              psVar60 = psVar60 + 1;
              seqStore->sequences = psVar60;
              uVar32 = *src;
              pUVar15[uVar32 * -0x30e4432345000000 >> (bVar28 & 0x3f)] = UVar29;
              pUVar14[uVar32 * -0x30e44323485a9b9d >> (bVar27 & 0x3f)] = UVar29;
              src = (void *)((long)src + sVar24 + 4);
              puVar55 = (ulong *)src;
              uVar42 = uVar53;
              uVar47 = uVar44;
              uVar44 = uVar53;
            } while (src <= puVar22);
          }
        }
        local_14c = uVar47;
      } while (puVar55 < puVar22);
    }
  }
  else if (uVar52 == 6) {
    if (uVar53 < uVar35) goto LAB_001ca021;
    if (ms->prefetchCDictTables != 0) {
      if (uVar31 < 0x3e) {
        uVar32 = 0;
        do {
          uVar32 = uVar32 + 0x40;
        } while (uVar32 < (ulong)(4L << (bVar25 & 0x3f)));
      }
      if (uVar47 < 0x3e) {
        uVar32 = 0;
        do {
          uVar32 = uVar32 + 0x40;
        } while (uVar32 < (ulong)(4L << (bVar26 & 0x3f)));
      }
    }
    if (uVar46 < local_14c) goto LAB_001ca040;
    puVar55 = (ulong *)((long)src + (ulong)(uVar46 == 0));
    if (uVar46 < uVar42) goto LAB_001ca05f;
    if (puVar55 < puVar22) {
      if ((((0x20 < uVar7) || (0x20 < uVar8)) || (0x20 < uVar44)) || (0x20 < uVar30))
      goto LAB_001ca002;
      bVar27 = 0x40 - cVar19;
      bVar28 = 0x40 - cVar20;
      puVar1 = (ulong *)((long)iEnd - 7);
      puVar2 = (ulong *)((long)iEnd - 3);
      puVar3 = (ulong *)((long)iEnd - 1);
      puVar23 = iEnd + -4;
      do {
        uVar32 = *puVar55;
        uVar45 = uVar32 * -0x30e44323485a9b9d >> (bVar27 & 0x3f);
        uVar48 = uVar32 * -0x30e4432340650000 >> (bVar28 & 0x3f);
        uVar43 = uVar32 * -0x30e44323485a9b9d >> (0x38 - bVar25 & 0x3f);
        uVar40 = uVar32 * -0x30e4432340650000 >> (0x38 - bVar26 & 0x3f);
        uVar44 = pUVar12[uVar43 >> 8];
        uVar35 = pUVar13[uVar40 >> 8];
        iVar54 = (int)puVar55;
        UVar51 = iVar54 - iVar41;
        uVar53 = pUVar14[uVar45];
        uVar36 = (ulong)uVar53;
        UVar29 = UVar51 + 1;
        uVar30 = UVar29 - local_14c;
        piVar59 = (int *)(pBVar9 + uVar30);
        if (uVar30 < uVar17) {
          piVar59 = (int *)(pBVar11 + (uVar30 - uVar57));
        }
        uVar31 = pUVar15[uVar48];
        pUVar15[uVar48] = UVar51;
        pUVar14[uVar45] = UVar51;
        uVar47 = local_14c;
        if (((uVar17 - 1) - uVar30 < 3) || (*piVar59 != *(int *)((long)puVar55 + 1))) {
          puVar56 = puVar55;
          if (uVar17 < uVar53) {
            puVar33 = (ulong *)(pBVar9 + uVar36);
            if (*puVar33 != uVar32) goto LAB_001c774b;
            puVar50 = puVar55 + 1;
            puVar38 = puVar33 + 1;
            puVar49 = puVar50;
            if (puVar50 < puVar1) {
              if (*puVar38 == *puVar50) {
                lVar34 = 0;
                do {
                  puVar38 = (ulong *)((long)puVar55 + lVar34 + 0x10);
                  if (puVar1 <= puVar38) {
                    puVar38 = (ulong *)(pBVar9 + lVar34 + uVar36 + 0x10);
                    puVar49 = (ulong *)((long)puVar55 + lVar34 + 0x10);
                    goto LAB_001c7b31;
                  }
                  lVar21 = lVar34 + uVar36 + 0x10;
                  uVar32 = *puVar38;
                  lVar34 = lVar34 + 8;
                } while (*(ulong *)(pBVar9 + lVar21) == uVar32);
                uVar32 = uVar32 ^ *(ulong *)(pBVar9 + lVar21);
                uVar40 = 0;
                if (uVar32 != 0) {
                  for (; (uVar32 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                  }
                }
                uVar32 = (uVar40 >> 3 & 0x1fffffff) + lVar34;
              }
              else {
                uVar40 = *puVar50 ^ *puVar38;
                uVar32 = 0;
                if (uVar40 != 0) {
                  for (; (uVar40 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                  }
                }
                uVar32 = uVar32 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_001c7b31:
              if ((puVar49 < puVar2) && ((int)*puVar38 == (int)*puVar49)) {
                puVar49 = (ulong *)((long)puVar49 + 4);
                puVar38 = (ulong *)((long)puVar38 + 4);
              }
              if ((puVar49 < puVar3) && ((short)*puVar38 == (short)*puVar49)) {
                puVar49 = (ulong *)((long)puVar49 + 2);
                puVar38 = (ulong *)((long)puVar38 + 2);
              }
              if (puVar49 < iEnd) {
                puVar49 = (ulong *)((long)puVar49 + (ulong)((BYTE)*puVar38 == (BYTE)*puVar49));
              }
              uVar32 = (long)puVar49 - (long)puVar50;
            }
            uVar32 = uVar32 + 8;
            uVar47 = iVar54 - (int)puVar33;
            if (puVar55 <= src) goto LAB_001c7d6e;
            piVar59 = (int *)(pBVar9 + (uVar36 - 1));
            puVar56 = (ulong *)((long)puVar55 + -1);
            do {
              if ((char)*puVar56 != (char)*piVar59) goto LAB_001c7d5a;
              uVar32 = uVar32 + 1;
              puVar55 = (ulong *)((long)puVar56 + -1);
            } while ((src < puVar56) &&
                    (bVar16 = iStart < piVar59, piVar59 = (int *)((long)piVar59 + -1),
                    puVar56 = puVar55, bVar16));
            goto LAB_001c7cb4;
          }
          if ((char)uVar43 == (char)uVar44) {
            uVar44 = uVar44 >> 8;
            puVar33 = (ulong *)(pBVar11 + uVar44);
            if (puVar33 < mEnd) {
              if ((uVar44 <= uVar6) || (*puVar33 != uVar32)) goto LAB_001c774b;
              sVar24 = ZSTD_count_2segments
                                 ((BYTE *)(puVar55 + 1),(BYTE *)(puVar33 + 1),(BYTE *)iEnd,
                                  (BYTE *)mEnd,(BYTE *)iStart);
              uVar32 = sVar24 + 8;
              uVar47 = UVar51 - (uVar44 + uVar57);
              if (src < puVar55) {
                piVar59 = (int *)(pBVar11 + ((ulong)uVar44 - 1));
                puVar56 = (ulong *)((long)puVar55 + -1);
                do {
                  if ((char)*puVar56 != (char)*piVar59) goto LAB_001c7d5a;
                  uVar32 = uVar32 + 1;
                  puVar55 = (ulong *)((long)puVar56 + -1);
                } while ((src < puVar56) &&
                        (bVar16 = piVar37 < piVar59, piVar59 = (int *)((long)piVar59 + -1),
                        puVar56 = puVar55, bVar16));
                goto LAB_001c7cb4;
              }
              goto LAB_001c7d6e;
            }
            goto LAB_001c9fe3;
          }
LAB_001c774b:
          if (uVar17 < uVar31) {
            piVar59 = (int *)(pBVar9 + uVar31);
            if (*piVar59 != (int)*puVar55) goto LAB_001c7886;
LAB_001c776f:
            uVar32 = *(ulong *)((long)puVar55 + 1);
            uVar43 = uVar32 * -0x30e44323485a9b9d >> (bVar27 & 0x3f);
            uVar40 = uVar32 * -0x30e44323485a9b9d >> (0x38 - bVar25 & 0x3f);
            puVar56 = (ulong *)((long)puVar55 + 1);
            uVar44 = pUVar14[uVar43];
            uVar36 = (ulong)uVar44;
            uVar35 = pUVar12[uVar40 >> 8];
            pUVar14[uVar43] = UVar29;
            if (uVar17 < uVar44) {
              puVar33 = (ulong *)(pBVar9 + uVar36);
              if (*puVar33 != uVar32) goto LAB_001c79d4;
              puVar50 = (ulong *)((long)puVar55 + 9);
              puVar38 = puVar33 + 1;
              puVar49 = puVar50;
              if (puVar50 < puVar1) {
                if (*puVar38 == *puVar50) {
                  lVar34 = 0;
                  do {
                    puVar38 = (ulong *)((long)puVar55 + lVar34 + 0x11);
                    if (puVar1 <= puVar38) {
                      puVar38 = (ulong *)(pBVar9 + lVar34 + uVar36 + 0x10);
                      puVar49 = (ulong *)((long)puVar55 + lVar34 + 0x11);
                      goto LAB_001c7cc7;
                    }
                    lVar21 = lVar34 + uVar36 + 0x10;
                    uVar32 = *puVar38;
                    lVar34 = lVar34 + 8;
                  } while (*(ulong *)(pBVar9 + lVar21) == uVar32);
                  uVar32 = uVar32 ^ *(ulong *)(pBVar9 + lVar21);
                  uVar40 = 0;
                  if (uVar32 != 0) {
                    for (; (uVar32 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                    }
                  }
                  uVar32 = (uVar40 >> 3 & 0x1fffffff) + lVar34;
                }
                else {
                  uVar40 = *puVar50 ^ *puVar38;
                  uVar32 = 0;
                  if (uVar40 != 0) {
                    for (; (uVar40 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                    }
                  }
                  uVar32 = uVar32 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_001c7cc7:
                if ((puVar49 < puVar2) && ((int)*puVar38 == (int)*puVar49)) {
                  puVar49 = (ulong *)((long)puVar49 + 4);
                  puVar38 = (ulong *)((long)puVar38 + 4);
                }
                if ((puVar49 < puVar3) && ((short)*puVar38 == (short)*puVar49)) {
                  puVar49 = (ulong *)((long)puVar49 + 2);
                  puVar38 = (ulong *)((long)puVar38 + 2);
                }
                if (puVar49 < iEnd) {
                  puVar49 = (ulong *)((long)puVar49 + (ulong)((BYTE)*puVar38 == (BYTE)*puVar49));
                }
                uVar32 = (long)puVar49 - (long)puVar50;
              }
              uVar32 = uVar32 + 8;
              uVar47 = (int)puVar56 - (int)puVar33;
              if (src < puVar56) {
                piVar59 = (int *)(pBVar9 + (uVar36 - 1));
                do {
                  if ((char)*puVar55 != (char)*piVar59) goto LAB_001c7cb4;
                  uVar32 = uVar32 + 1;
                  puVar56 = (ulong *)((long)puVar55 + -1);
                } while ((src < puVar55) &&
                        (bVar16 = iStart < piVar59, piVar59 = (int *)((long)piVar59 + -1),
                        puVar55 = puVar56, bVar16));
LAB_001c7d5a:
                puVar56 = (ulong *)((long)puVar56 + 1);
              }
            }
            else {
              if ((char)uVar40 == (char)uVar35) {
                uVar35 = uVar35 >> 8;
                puVar33 = (ulong *)(pBVar11 + uVar35);
                if (mEnd <= puVar33) goto LAB_001ca07e;
                if ((uVar6 < uVar35) && (*puVar33 == uVar32)) {
                  sVar24 = ZSTD_count_2segments
                                     ((BYTE *)((long)puVar55 + 9),(BYTE *)(puVar33 + 1),(BYTE *)iEnd
                                      ,(BYTE *)mEnd,(BYTE *)iStart);
                  uVar32 = sVar24 + 8;
                  uVar47 = UVar29 - (uVar57 + uVar35);
                  if (src < puVar56) {
                    piVar59 = (int *)(pBVar11 + ((ulong)uVar35 - 1));
                    do {
                      if ((char)*puVar55 != (char)*piVar59) goto LAB_001c7cb4;
                      uVar32 = uVar32 + 1;
                      puVar56 = (ulong *)((long)puVar55 + -1);
                    } while ((src < puVar55) &&
                            (bVar16 = piVar37 < piVar59, piVar59 = (int *)((long)piVar59 + -1),
                            puVar55 = puVar56, bVar16));
LAB_001c79c9:
                    puVar56 = (ulong *)((long)puVar56 + 1);
                  }
                  goto LAB_001c7d6e;
                }
              }
LAB_001c79d4:
              puVar56 = (ulong *)((long)puVar55 + 4);
              puVar33 = (ulong *)(piVar59 + 1);
              if (uVar31 < uVar17) {
                sVar24 = ZSTD_count_2segments
                                   ((BYTE *)puVar56,(BYTE *)puVar33,(BYTE *)iEnd,(BYTE *)mEnd,
                                    (BYTE *)iStart);
                uVar32 = sVar24 + 4;
                uVar47 = UVar51 - uVar31;
                puVar56 = puVar55;
                if ((src < puVar55) && (piVar37 < piVar59)) {
                  puVar56 = (ulong *)((long)puVar55 + -1);
                  do {
                    piVar59 = (int *)((long)piVar59 + -1);
                    if ((char)*puVar56 != *(char *)piVar59) goto LAB_001c79c9;
                    uVar32 = uVar32 + 1;
                    puVar55 = (ulong *)((long)puVar56 + -1);
                  } while ((src < puVar56) && (puVar56 = puVar55, piVar37 < piVar59));
LAB_001c7cb4:
                  puVar56 = (ulong *)((long)puVar55 + 1);
                }
              }
              else {
                puVar50 = puVar56;
                if (puVar56 < puVar1) {
                  if (*puVar33 == *puVar56) {
                    lVar34 = 0;
                    do {
                      puVar33 = (ulong *)((long)puVar55 + lVar34 + 0xc);
                      if (puVar1 <= puVar33) {
                        puVar33 = (ulong *)((long)piVar59 + lVar34 + 0xc);
                        puVar50 = (ulong *)((long)puVar55 + lVar34 + 0xc);
                        goto LAB_001c7c13;
                      }
                      uVar32 = *(ulong *)((long)piVar59 + lVar34 + 0xc);
                      uVar36 = *puVar33;
                      lVar34 = lVar34 + 8;
                    } while (uVar32 == uVar36);
                    uVar36 = uVar36 ^ uVar32;
                    uVar32 = 0;
                    if (uVar36 != 0) {
                      for (; (uVar36 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                      }
                    }
                    uVar32 = (uVar32 >> 3 & 0x1fffffff) + lVar34;
                  }
                  else {
                    uVar36 = *puVar56 ^ *puVar33;
                    uVar32 = 0;
                    if (uVar36 != 0) {
                      for (; (uVar36 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                      }
                    }
                    uVar32 = uVar32 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_001c7c13:
                  if ((puVar50 < puVar2) && ((int)*puVar33 == (int)*puVar50)) {
                    puVar50 = (ulong *)((long)puVar50 + 4);
                    puVar33 = (ulong *)((long)puVar33 + 4);
                  }
                  if ((puVar50 < puVar3) && ((short)*puVar33 == (short)*puVar50)) {
                    puVar50 = (ulong *)((long)puVar50 + 2);
                    puVar33 = (ulong *)((long)puVar33 + 2);
                  }
                  if (puVar50 < iEnd) {
                    puVar50 = (ulong *)((long)puVar50 + (ulong)((BYTE)*puVar33 == (BYTE)*puVar50));
                  }
                  uVar32 = (long)puVar50 - (long)puVar56;
                }
                uVar32 = uVar32 + 4;
                uVar47 = iVar54 - (int)piVar59;
                puVar56 = puVar55;
                if ((src < puVar55) && (iStart < piVar59)) {
                  puVar56 = (ulong *)((long)puVar55 + -1);
                  do {
                    piVar59 = (int *)((long)piVar59 + -1);
                    if ((char)*puVar56 != *(char *)piVar59) goto LAB_001c79c9;
                    uVar32 = uVar32 + 1;
                    puVar55 = (ulong *)((long)puVar56 + -1);
                  } while ((src < puVar56) && (puVar56 = puVar55, iStart < piVar59));
                  goto LAB_001c7cb4;
                }
              }
            }
LAB_001c7d6e:
            if (uVar47 != 0) {
              if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                  seqStore->maxNbSeq) {
                if (seqStore->maxNbLit < 0x20001) {
                  uVar36 = (long)puVar56 - (long)src;
                  puVar55 = (ulong *)seqStore->lit;
                  if ((BYTE *)((long)puVar55 + uVar36) <= seqStore->litStart + seqStore->maxNbLit) {
                    if (puVar56 <= iEnd) {
                      if (puVar23 < puVar56) {
                        ZSTD_safecopyLiterals
                                  ((BYTE *)puVar55,(BYTE *)src,(BYTE *)puVar56,(BYTE *)puVar23);
LAB_001c7ddd:
                        seqStore->lit = seqStore->lit + uVar36;
                        if (0xffff < uVar36) {
                          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001c9fa5;
                          seqStore->longLengthType = ZSTD_llt_literalLength;
                          seqStore->longLengthPos =
                               (U32)((ulong)((long)seqStore->sequences -
                                            (long)seqStore->sequencesStart) >> 3);
                        }
                      }
                      else {
                        uVar40 = *(ulong *)((long)src + 8);
                        *puVar55 = *src;
                        puVar55[1] = uVar40;
                        pBVar39 = seqStore->lit;
                        if (0x10 < uVar36) {
                          if ((ulong)((long)(pBVar39 + 0x10) + (-0x10 - ((long)src + 0x10))) <
                              0xffffffffffffffe1) {
                            uVar40 = *(ulong *)((long)src + 0x18);
                            *(ulong *)(pBVar39 + 0x10) = *(ulong *)((long)src + 0x10);
                            *(ulong *)(pBVar39 + 0x18) = uVar40;
                            if (0x20 < (long)uVar36) {
                              lVar34 = 0;
                              do {
                                puVar5 = (undefined8 *)((long)src + lVar34 + 0x20);
                                uVar18 = puVar5[1];
                                pBVar4 = pBVar39 + lVar34 + 0x20;
                                *(undefined8 *)pBVar4 = *puVar5;
                                *(undefined8 *)(pBVar4 + 8) = uVar18;
                                puVar5 = (undefined8 *)((long)src + lVar34 + 0x30);
                                uVar18 = puVar5[1];
                                *(undefined8 *)(pBVar4 + 0x10) = *puVar5;
                                *(undefined8 *)(pBVar4 + 0x18) = uVar18;
                                lVar34 = lVar34 + 0x20;
                              } while (pBVar4 + 0x20 < pBVar39 + uVar36);
                            }
                            goto LAB_001c7ddd;
                          }
                          goto LAB_001c9fc4;
                        }
                        seqStore->lit = pBVar39 + uVar36;
                      }
                      psVar60 = seqStore->sequences;
                      psVar60->litLength = (U16)uVar36;
                      psVar60->offBase = uVar47 + 3;
                      if (2 < uVar32) {
                        uVar36 = uVar32 - 3;
                        uVar42 = local_14c;
                        if (uVar36 < 0x10000) goto LAB_001c7edd;
                        if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_001c7ebe;
                        goto LAB_001c9f67;
                      }
                      goto LAB_001c9f0a;
                    }
                    goto LAB_001c9f48;
                  }
                  goto LAB_001c9f29;
                }
                goto LAB_001c9eeb;
              }
              goto LAB_001c9ecc;
            }
            goto LAB_001c9f86;
          }
          if ((char)uVar40 == (char)uVar35) {
            uVar35 = uVar35 >> 8;
            if ((uVar6 < uVar35) && (*(int *)(pBVar11 + uVar35) == (int)*puVar55)) {
              uVar31 = uVar35 + uVar57;
              piVar59 = (int *)(pBVar11 + uVar35);
              goto LAB_001c776f;
            }
          }
LAB_001c7886:
          puVar55 = (ulong *)((long)puVar55 + ((long)puVar55 - (long)src >> 8) + 1);
        }
        else {
          puVar56 = iEnd;
          if (uVar30 < uVar17) {
            puVar56 = mEnd;
          }
          sVar24 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar55 + 5),(BYTE *)(piVar59 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar56,(BYTE *)iStart);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_001c9ecc;
          if (0x20000 < seqStore->maxNbLit) goto LAB_001c9eeb;
          puVar56 = (ulong *)((long)puVar55 + 1);
          uVar36 = (long)puVar56 - (long)src;
          puVar55 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar55 + uVar36))
          goto LAB_001c9f29;
          if (iEnd < puVar56) goto LAB_001c9f48;
          if (puVar23 < puVar56) {
            ZSTD_safecopyLiterals((BYTE *)puVar55,(BYTE *)src,(BYTE *)puVar56,(BYTE *)puVar23);
LAB_001c75c4:
            seqStore->lit = seqStore->lit + uVar36;
            if (0xffff < uVar36) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001c9fa5;
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            uVar32 = *(ulong *)((long)src + 8);
            *puVar55 = *src;
            puVar55[1] = uVar32;
            pBVar39 = seqStore->lit;
            if (0x10 < uVar36) {
              if ((ulong)((long)(pBVar39 + 0x10) + (-0x10 - ((long)src + 0x10))) <
                  0xffffffffffffffe1) {
                uVar32 = *(ulong *)((long)src + 0x18);
                *(ulong *)(pBVar39 + 0x10) = *(ulong *)((long)src + 0x10);
                *(ulong *)(pBVar39 + 0x18) = uVar32;
                if (0x20 < (long)uVar36) {
                  lVar34 = 0;
                  do {
                    puVar5 = (undefined8 *)((long)src + lVar34 + 0x20);
                    uVar18 = puVar5[1];
                    pBVar4 = pBVar39 + lVar34 + 0x20;
                    *(undefined8 *)pBVar4 = *puVar5;
                    *(undefined8 *)(pBVar4 + 8) = uVar18;
                    puVar5 = (undefined8 *)((long)src + lVar34 + 0x30);
                    uVar18 = puVar5[1];
                    *(undefined8 *)(pBVar4 + 0x10) = *puVar5;
                    *(undefined8 *)(pBVar4 + 0x18) = uVar18;
                    lVar34 = lVar34 + 0x20;
                  } while (pBVar4 + 0x20 < pBVar39 + uVar36);
                }
                goto LAB_001c75c4;
              }
              goto LAB_001c9fc4;
            }
            seqStore->lit = pBVar39 + uVar36;
          }
          uVar32 = sVar24 + 4;
          psVar60 = seqStore->sequences;
          psVar60->litLength = (U16)uVar36;
          psVar60->offBase = 1;
          if (uVar32 < 3) goto LAB_001c9f0a;
          uVar36 = sVar24 + 1;
          if (0xffff < uVar36) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001c9f67;
LAB_001c7ebe:
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar60 - (long)seqStore->sequencesStart) >> 3);
          }
LAB_001c7edd:
          src = (void *)(uVar32 + (long)puVar56);
          psVar60->mlBase = (U16)uVar36;
          psVar60 = psVar60 + 1;
          seqStore->sequences = psVar60;
          puVar55 = (ulong *)src;
          if (src <= puVar22) {
            uVar44 = UVar51 + 2;
            lVar34 = *(long *)(pBVar9 + uVar44);
            pUVar14[(ulong)(lVar34 * -0x30e44323485a9b9d) >> (bVar27 & 0x3f)] = uVar44;
            pUVar14[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar27 & 0x3f)] =
                 ((int)src + -2) - iVar41;
            pUVar15[(ulong)(lVar34 * -0x30e4432340650000) >> (bVar28 & 0x3f)] = uVar44;
            pUVar15[(ulong)(*(long *)((long)src + -1) * -0x30e4432340650000) >> (bVar28 & 0x3f)] =
                 ((int)src + -1) - iVar41;
            uVar44 = uVar42;
            do {
              uVar53 = uVar47;
              UVar29 = (int)src - iVar41;
              uVar35 = UVar29 - uVar44;
              pBVar39 = pBVar9;
              if (uVar35 < uVar17) {
                pBVar39 = pBVar11 + -uVar58;
              }
              puVar55 = (ulong *)src;
              uVar42 = uVar44;
              uVar47 = uVar53;
              if (((uVar17 - 1) - uVar35 < 3) || (*(int *)(pBVar39 + uVar35) != (int)*src)) break;
              puVar55 = iEnd;
              if (uVar35 < uVar17) {
                puVar55 = mEnd;
              }
              sVar24 = ZSTD_count_2segments
                                 ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar39 + uVar35) + 4),
                                  (BYTE *)iEnd,(BYTE *)puVar55,(BYTE *)iStart);
              if (seqStore->maxNbSeq <= (ulong)((long)psVar60 - (long)seqStore->sequencesStart >> 3)
                 ) goto LAB_001c9ecc;
              if (0x20000 < seqStore->maxNbLit) goto LAB_001c9eeb;
              puVar55 = (ulong *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < puVar55) goto LAB_001c9f29;
              if (iEnd < src) goto LAB_001c9f48;
              if (puVar23 < src) {
                ZSTD_safecopyLiterals((BYTE *)puVar55,(BYTE *)src,(BYTE *)src,(BYTE *)puVar23);
              }
              else {
                uVar32 = *(ulong *)((long)src + 8);
                *puVar55 = *src;
                puVar55[1] = uVar32;
              }
              psVar60 = seqStore->sequences;
              psVar60->litLength = 0;
              psVar60->offBase = 1;
              if (sVar24 + 4 < 3) goto LAB_001c9f0a;
              if (0xffff < sVar24 + 1) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001c9f67;
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar60 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar60->mlBase = (U16)(sVar24 + 1);
              psVar60 = psVar60 + 1;
              seqStore->sequences = psVar60;
              uVar32 = *src;
              pUVar15[uVar32 * -0x30e4432340650000 >> (bVar28 & 0x3f)] = UVar29;
              pUVar14[uVar32 * -0x30e44323485a9b9d >> (bVar27 & 0x3f)] = UVar29;
              src = (void *)((long)src + sVar24 + 4);
              puVar55 = (ulong *)src;
              uVar42 = uVar53;
              uVar47 = uVar44;
              uVar44 = uVar53;
            } while (src <= puVar22);
          }
        }
        local_14c = uVar47;
      } while (puVar55 < puVar22);
    }
  }
  else if (uVar52 == 7) {
    if (uVar53 < uVar35) {
LAB_001ca021:
      __assert_fail("ms->window.dictLimit + (1U << cParams->windowLog) >= endIndex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_double_fast.c"
                    ,0x15a,
                    "size_t ZSTD_compressBlock_doubleFast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
    if (ms->prefetchCDictTables != 0) {
      if (uVar31 < 0x3e) {
        uVar32 = 0;
        do {
          uVar32 = uVar32 + 0x40;
        } while (uVar32 < (ulong)(4L << (bVar25 & 0x3f)));
      }
      if (uVar47 < 0x3e) {
        uVar32 = 0;
        do {
          uVar32 = uVar32 + 0x40;
        } while (uVar32 < (ulong)(4L << (bVar26 & 0x3f)));
      }
    }
    if (uVar46 < local_14c) {
LAB_001ca040:
      __assert_fail("offset_1 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_double_fast.c"
                    ,0x168,
                    "size_t ZSTD_compressBlock_doubleFast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
    puVar55 = (ulong *)((long)src + (ulong)(uVar46 == 0));
    if (uVar46 < uVar42) {
LAB_001ca05f:
      __assert_fail("offset_2 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_double_fast.c"
                    ,0x169,
                    "size_t ZSTD_compressBlock_doubleFast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
    if (puVar55 < puVar22) {
      if ((((0x20 < uVar7) || (0x20 < uVar8)) || (0x20 < uVar44)) || (0x20 < uVar30)) {
LAB_001ca002:
        __assert_fail("hBits <= 32",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
      }
      bVar27 = 0x40 - cVar19;
      bVar28 = 0x40 - cVar20;
      puVar1 = (ulong *)((long)iEnd - 7);
      puVar2 = (ulong *)((long)iEnd - 3);
      puVar3 = (ulong *)((long)iEnd - 1);
      puVar23 = iEnd + -4;
      do {
        uVar32 = *puVar55;
        uVar45 = uVar32 * -0x30e44323485a9b9d >> (bVar27 & 0x3f);
        uVar48 = uVar32 * -0x30e44323405a9d00 >> (bVar28 & 0x3f);
        uVar43 = uVar32 * -0x30e44323485a9b9d >> (0x38 - bVar25 & 0x3f);
        uVar40 = uVar32 * -0x30e44323405a9d00 >> (0x38 - bVar26 & 0x3f);
        uVar44 = pUVar12[uVar43 >> 8];
        uVar35 = pUVar13[uVar40 >> 8];
        iVar54 = (int)puVar55;
        UVar51 = iVar54 - iVar41;
        uVar53 = pUVar14[uVar45];
        uVar36 = (ulong)uVar53;
        UVar29 = UVar51 + 1;
        uVar30 = UVar29 - local_14c;
        piVar59 = (int *)(pBVar9 + uVar30);
        if (uVar30 < uVar17) {
          piVar59 = (int *)(pBVar11 + (uVar30 - uVar57));
        }
        uVar31 = pUVar15[uVar48];
        pUVar15[uVar48] = UVar51;
        pUVar14[uVar45] = UVar51;
        uVar47 = local_14c;
        if (((uVar17 - 1) - uVar30 < 3) || (*piVar59 != *(int *)((long)puVar55 + 1))) {
          puVar56 = puVar55;
          if (uVar17 < uVar53) {
            puVar33 = (ulong *)(pBVar9 + uVar36);
            if (*puVar33 != uVar32) goto LAB_001c68dd;
            puVar50 = puVar55 + 1;
            puVar38 = puVar33 + 1;
            puVar49 = puVar50;
            if (puVar50 < puVar1) {
              if (*puVar38 == *puVar50) {
                lVar34 = 0;
                do {
                  puVar38 = (ulong *)((long)puVar55 + lVar34 + 0x10);
                  if (puVar1 <= puVar38) {
                    puVar38 = (ulong *)(pBVar9 + lVar34 + uVar36 + 0x10);
                    puVar49 = (ulong *)((long)puVar55 + lVar34 + 0x10);
                    goto LAB_001c6cc3;
                  }
                  lVar21 = lVar34 + uVar36 + 0x10;
                  uVar32 = *puVar38;
                  lVar34 = lVar34 + 8;
                } while (*(ulong *)(pBVar9 + lVar21) == uVar32);
                uVar32 = uVar32 ^ *(ulong *)(pBVar9 + lVar21);
                uVar40 = 0;
                if (uVar32 != 0) {
                  for (; (uVar32 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                  }
                }
                uVar32 = (uVar40 >> 3 & 0x1fffffff) + lVar34;
              }
              else {
                uVar40 = *puVar50 ^ *puVar38;
                uVar32 = 0;
                if (uVar40 != 0) {
                  for (; (uVar40 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                  }
                }
                uVar32 = uVar32 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_001c6cc3:
              if ((puVar49 < puVar2) && ((int)*puVar38 == (int)*puVar49)) {
                puVar49 = (ulong *)((long)puVar49 + 4);
                puVar38 = (ulong *)((long)puVar38 + 4);
              }
              if ((puVar49 < puVar3) && ((short)*puVar38 == (short)*puVar49)) {
                puVar49 = (ulong *)((long)puVar49 + 2);
                puVar38 = (ulong *)((long)puVar38 + 2);
              }
              if (puVar49 < iEnd) {
                puVar49 = (ulong *)((long)puVar49 + (ulong)((BYTE)*puVar38 == (BYTE)*puVar49));
              }
              uVar32 = (long)puVar49 - (long)puVar50;
            }
            uVar32 = uVar32 + 8;
            uVar47 = iVar54 - (int)puVar33;
            if (puVar55 <= src) goto LAB_001c6f00;
            piVar59 = (int *)(pBVar9 + (uVar36 - 1));
            puVar56 = (ulong *)((long)puVar55 + -1);
            do {
              if ((char)*puVar56 != (char)*piVar59) goto LAB_001c6eec;
              uVar32 = uVar32 + 1;
              puVar55 = (ulong *)((long)puVar56 + -1);
            } while ((src < puVar56) &&
                    (bVar16 = iStart < piVar59, piVar59 = (int *)((long)piVar59 + -1),
                    puVar56 = puVar55, bVar16));
            goto LAB_001c6e46;
          }
          if ((char)uVar43 == (char)uVar44) {
            uVar44 = uVar44 >> 8;
            puVar33 = (ulong *)(pBVar11 + uVar44);
            if (mEnd <= puVar33) {
LAB_001c9fe3:
              __assert_fail("dictMatchL < dictEnd",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_double_fast.c"
                            ,0x198,
                            "size_t ZSTD_compressBlock_doubleFast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                           );
            }
            if ((uVar44 <= uVar6) || (*puVar33 != uVar32)) goto LAB_001c68dd;
            sVar24 = ZSTD_count_2segments
                               ((BYTE *)(puVar55 + 1),(BYTE *)(puVar33 + 1),(BYTE *)iEnd,
                                (BYTE *)mEnd,(BYTE *)iStart);
            uVar32 = sVar24 + 8;
            uVar47 = UVar51 - (uVar44 + uVar57);
            if (src < puVar55) {
              piVar59 = (int *)(pBVar11 + ((ulong)uVar44 - 1));
              puVar56 = (ulong *)((long)puVar55 + -1);
              do {
                if ((char)*puVar56 != (char)*piVar59) goto LAB_001c6eec;
                uVar32 = uVar32 + 1;
                puVar55 = (ulong *)((long)puVar56 + -1);
              } while ((src < puVar56) &&
                      (bVar16 = piVar37 < piVar59, piVar59 = (int *)((long)piVar59 + -1),
                      puVar56 = puVar55, bVar16));
              goto LAB_001c6e46;
            }
            goto LAB_001c6f00;
          }
LAB_001c68dd:
          if (uVar17 < uVar31) {
            piVar59 = (int *)(pBVar9 + uVar31);
            if (*piVar59 != (int)*puVar55) goto LAB_001c6a18;
LAB_001c6908:
            uVar32 = *(ulong *)((long)puVar55 + 1);
            uVar43 = uVar32 * -0x30e44323485a9b9d >> (bVar27 & 0x3f);
            uVar40 = uVar32 * -0x30e44323485a9b9d >> (0x38 - bVar25 & 0x3f);
            puVar56 = (ulong *)((long)puVar55 + 1);
            uVar44 = pUVar14[uVar43];
            uVar36 = (ulong)uVar44;
            uVar35 = pUVar12[uVar40 >> 8];
            pUVar14[uVar43] = UVar29;
            if (uVar17 < uVar44) {
              puVar33 = (ulong *)(pBVar9 + uVar36);
              if (*puVar33 != uVar32) goto LAB_001c6b66;
              puVar50 = (ulong *)((long)puVar55 + 9);
              puVar38 = puVar33 + 1;
              puVar49 = puVar50;
              if (puVar50 < puVar1) {
                if (*puVar38 == *puVar50) {
                  lVar34 = 0;
                  do {
                    puVar38 = (ulong *)((long)puVar55 + lVar34 + 0x11);
                    if (puVar1 <= puVar38) {
                      puVar38 = (ulong *)(pBVar9 + lVar34 + uVar36 + 0x10);
                      puVar49 = (ulong *)((long)puVar55 + lVar34 + 0x11);
                      goto LAB_001c6e59;
                    }
                    lVar21 = lVar34 + uVar36 + 0x10;
                    uVar32 = *puVar38;
                    lVar34 = lVar34 + 8;
                  } while (*(ulong *)(pBVar9 + lVar21) == uVar32);
                  uVar32 = uVar32 ^ *(ulong *)(pBVar9 + lVar21);
                  uVar40 = 0;
                  if (uVar32 != 0) {
                    for (; (uVar32 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                    }
                  }
                  uVar32 = (uVar40 >> 3 & 0x1fffffff) + lVar34;
                }
                else {
                  uVar40 = *puVar50 ^ *puVar38;
                  uVar32 = 0;
                  if (uVar40 != 0) {
                    for (; (uVar40 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                    }
                  }
                  uVar32 = uVar32 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_001c6e59:
                if ((puVar49 < puVar2) && ((int)*puVar38 == (int)*puVar49)) {
                  puVar49 = (ulong *)((long)puVar49 + 4);
                  puVar38 = (ulong *)((long)puVar38 + 4);
                }
                if ((puVar49 < puVar3) && ((short)*puVar38 == (short)*puVar49)) {
                  puVar49 = (ulong *)((long)puVar49 + 2);
                  puVar38 = (ulong *)((long)puVar38 + 2);
                }
                if (puVar49 < iEnd) {
                  puVar49 = (ulong *)((long)puVar49 + (ulong)((BYTE)*puVar38 == (BYTE)*puVar49));
                }
                uVar32 = (long)puVar49 - (long)puVar50;
              }
              uVar32 = uVar32 + 8;
              uVar47 = (int)puVar56 - (int)puVar33;
              if (src < puVar56) {
                piVar59 = (int *)(pBVar9 + (uVar36 - 1));
                do {
                  if ((char)*puVar55 != (char)*piVar59) goto LAB_001c6e46;
                  uVar32 = uVar32 + 1;
                  puVar56 = (ulong *)((long)puVar55 + -1);
                } while ((src < puVar55) &&
                        (bVar16 = iStart < piVar59, piVar59 = (int *)((long)piVar59 + -1),
                        puVar55 = puVar56, bVar16));
LAB_001c6eec:
                puVar56 = (ulong *)((long)puVar56 + 1);
              }
            }
            else {
              if ((char)uVar40 == (char)uVar35) {
                uVar35 = uVar35 >> 8;
                puVar33 = (ulong *)(pBVar11 + uVar35);
                if (mEnd <= puVar33) {
LAB_001ca07e:
                  __assert_fail("dictMatchL3 < dictEnd",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_double_fast.c"
                                ,0x1cc,
                                "size_t ZSTD_compressBlock_doubleFast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                               );
                }
                if ((uVar6 < uVar35) && (*puVar33 == uVar32)) {
                  sVar24 = ZSTD_count_2segments
                                     ((BYTE *)((long)puVar55 + 9),(BYTE *)(puVar33 + 1),(BYTE *)iEnd
                                      ,(BYTE *)mEnd,(BYTE *)iStart);
                  uVar32 = sVar24 + 8;
                  uVar47 = UVar29 - (uVar57 + uVar35);
                  if (src < puVar56) {
                    piVar59 = (int *)(pBVar11 + ((ulong)uVar35 - 1));
                    do {
                      if ((char)*puVar55 != (char)*piVar59) goto LAB_001c6e46;
                      uVar32 = uVar32 + 1;
                      puVar56 = (ulong *)((long)puVar55 + -1);
                    } while ((src < puVar55) &&
                            (bVar16 = piVar37 < piVar59, piVar59 = (int *)((long)piVar59 + -1),
                            puVar55 = puVar56, bVar16));
LAB_001c6b5b:
                    puVar56 = (ulong *)((long)puVar56 + 1);
                  }
                  goto LAB_001c6f00;
                }
              }
LAB_001c6b66:
              puVar56 = (ulong *)((long)puVar55 + 4);
              puVar33 = (ulong *)(piVar59 + 1);
              if (uVar31 < uVar17) {
                sVar24 = ZSTD_count_2segments
                                   ((BYTE *)puVar56,(BYTE *)puVar33,(BYTE *)iEnd,(BYTE *)mEnd,
                                    (BYTE *)iStart);
                uVar32 = sVar24 + 4;
                uVar47 = UVar51 - uVar31;
                puVar56 = puVar55;
                if ((src < puVar55) && (piVar37 < piVar59)) {
                  puVar56 = (ulong *)((long)puVar55 + -1);
                  do {
                    piVar59 = (int *)((long)piVar59 + -1);
                    if ((char)*puVar56 != *(char *)piVar59) goto LAB_001c6b5b;
                    uVar32 = uVar32 + 1;
                    puVar55 = (ulong *)((long)puVar56 + -1);
                  } while ((src < puVar56) && (puVar56 = puVar55, piVar37 < piVar59));
LAB_001c6e46:
                  puVar56 = (ulong *)((long)puVar55 + 1);
                }
              }
              else {
                puVar50 = puVar56;
                if (puVar56 < puVar1) {
                  if (*puVar33 == *puVar56) {
                    lVar34 = 0;
                    do {
                      puVar33 = (ulong *)((long)puVar55 + lVar34 + 0xc);
                      if (puVar1 <= puVar33) {
                        puVar33 = (ulong *)((long)piVar59 + lVar34 + 0xc);
                        puVar50 = (ulong *)((long)puVar55 + lVar34 + 0xc);
                        goto LAB_001c6da5;
                      }
                      uVar32 = *(ulong *)((long)piVar59 + lVar34 + 0xc);
                      uVar36 = *puVar33;
                      lVar34 = lVar34 + 8;
                    } while (uVar32 == uVar36);
                    uVar36 = uVar36 ^ uVar32;
                    uVar32 = 0;
                    if (uVar36 != 0) {
                      for (; (uVar36 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                      }
                    }
                    uVar32 = (uVar32 >> 3 & 0x1fffffff) + lVar34;
                  }
                  else {
                    uVar36 = *puVar56 ^ *puVar33;
                    uVar32 = 0;
                    if (uVar36 != 0) {
                      for (; (uVar36 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                      }
                    }
                    uVar32 = uVar32 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_001c6da5:
                  if ((puVar50 < puVar2) && ((int)*puVar33 == (int)*puVar50)) {
                    puVar50 = (ulong *)((long)puVar50 + 4);
                    puVar33 = (ulong *)((long)puVar33 + 4);
                  }
                  if ((puVar50 < puVar3) && ((short)*puVar33 == (short)*puVar50)) {
                    puVar50 = (ulong *)((long)puVar50 + 2);
                    puVar33 = (ulong *)((long)puVar33 + 2);
                  }
                  if (puVar50 < iEnd) {
                    puVar50 = (ulong *)((long)puVar50 + (ulong)((BYTE)*puVar33 == (BYTE)*puVar50));
                  }
                  uVar32 = (long)puVar50 - (long)puVar56;
                }
                uVar32 = uVar32 + 4;
                uVar47 = iVar54 - (int)piVar59;
                puVar56 = puVar55;
                if ((src < puVar55) && (iStart < piVar59)) {
                  puVar56 = (ulong *)((long)puVar55 + -1);
                  do {
                    piVar59 = (int *)((long)piVar59 + -1);
                    if ((char)*puVar56 != *(char *)piVar59) goto LAB_001c6b5b;
                    uVar32 = uVar32 + 1;
                    puVar55 = (ulong *)((long)puVar56 + -1);
                  } while ((src < puVar56) && (puVar56 = puVar55, iStart < piVar59));
                  goto LAB_001c6e46;
                }
              }
            }
LAB_001c6f00:
            if (uVar47 == 0) {
LAB_001c9f86:
              __assert_fail("(offset)>0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_double_fast.c"
                            ,0x1e4,
                            "size_t ZSTD_compressBlock_doubleFast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                           );
            }
            if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                seqStore->maxNbSeq) {
              if (seqStore->maxNbLit < 0x20001) {
                uVar36 = (long)puVar56 - (long)src;
                puVar55 = (ulong *)seqStore->lit;
                if ((BYTE *)((long)puVar55 + uVar36) <= seqStore->litStart + seqStore->maxNbLit) {
                  if (puVar56 <= iEnd) {
                    if (puVar23 < puVar56) {
                      ZSTD_safecopyLiterals
                                ((BYTE *)puVar55,(BYTE *)src,(BYTE *)puVar56,(BYTE *)puVar23);
LAB_001c6f6f:
                      seqStore->lit = seqStore->lit + uVar36;
                      if (0xffff < uVar36) {
                        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001c9fa5;
                        seqStore->longLengthType = ZSTD_llt_literalLength;
                        seqStore->longLengthPos =
                             (U32)((ulong)((long)seqStore->sequences -
                                          (long)seqStore->sequencesStart) >> 3);
                      }
                    }
                    else {
                      uVar40 = *(ulong *)((long)src + 8);
                      *puVar55 = *src;
                      puVar55[1] = uVar40;
                      pBVar39 = seqStore->lit;
                      if (0x10 < uVar36) {
                        if ((ulong)((long)(pBVar39 + 0x10) + (-0x10 - ((long)src + 0x10))) <
                            0xffffffffffffffe1) {
                          uVar40 = *(ulong *)((long)src + 0x18);
                          *(ulong *)(pBVar39 + 0x10) = *(ulong *)((long)src + 0x10);
                          *(ulong *)(pBVar39 + 0x18) = uVar40;
                          if (0x20 < (long)uVar36) {
                            lVar34 = 0;
                            do {
                              puVar5 = (undefined8 *)((long)src + lVar34 + 0x20);
                              uVar18 = puVar5[1];
                              pBVar4 = pBVar39 + lVar34 + 0x20;
                              *(undefined8 *)pBVar4 = *puVar5;
                              *(undefined8 *)(pBVar4 + 8) = uVar18;
                              puVar5 = (undefined8 *)((long)src + lVar34 + 0x30);
                              uVar18 = puVar5[1];
                              *(undefined8 *)(pBVar4 + 0x10) = *puVar5;
                              *(undefined8 *)(pBVar4 + 0x18) = uVar18;
                              lVar34 = lVar34 + 0x20;
                            } while (pBVar4 + 0x20 < pBVar39 + uVar36);
                          }
                          goto LAB_001c6f6f;
                        }
                        goto LAB_001c9fc4;
                      }
                      seqStore->lit = pBVar39 + uVar36;
                    }
                    psVar60 = seqStore->sequences;
                    psVar60->litLength = (U16)uVar36;
                    psVar60->offBase = uVar47 + 3;
                    if (2 < uVar32) {
                      uVar36 = uVar32 - 3;
                      uVar42 = local_14c;
                      if (uVar36 < 0x10000) goto LAB_001c706f;
                      if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_001c7050;
LAB_001c9f67:
                      __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                                    ,0x2bf,
                                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                                   );
                    }
                    goto LAB_001c9f0a;
                  }
                  goto LAB_001c9f48;
                }
                goto LAB_001c9f29;
              }
              goto LAB_001c9eeb;
            }
            goto LAB_001c9ecc;
          }
          if ((char)uVar40 == (char)uVar35) {
            uVar35 = uVar35 >> 8;
            if ((uVar6 < uVar35) && (*(int *)(pBVar11 + uVar35) == (int)*puVar55)) {
              uVar31 = uVar35 + uVar57;
              piVar59 = (int *)(pBVar11 + uVar35);
              goto LAB_001c6908;
            }
          }
LAB_001c6a18:
          puVar55 = (ulong *)((long)puVar55 + ((long)puVar55 - (long)src >> 8) + 1);
        }
        else {
          puVar56 = iEnd;
          if (uVar30 < uVar17) {
            puVar56 = mEnd;
          }
          sVar24 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar55 + 5),(BYTE *)(piVar59 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar56,(BYTE *)iStart);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_001c9ecc:
            __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x29d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0x20000 < seqStore->maxNbLit) {
LAB_001c9eeb:
            __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x29f,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          puVar56 = (ulong *)((long)puVar55 + 1);
          uVar36 = (long)puVar56 - (long)src;
          puVar55 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar55 + uVar36)) {
LAB_001c9f29:
            __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2a0,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (iEnd < puVar56) {
LAB_001c9f48:
            __assert_fail("literals + litLength <= litLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2a1,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (puVar23 < puVar56) {
            ZSTD_safecopyLiterals((BYTE *)puVar55,(BYTE *)src,(BYTE *)puVar56,(BYTE *)puVar23);
LAB_001c674e:
            seqStore->lit = seqStore->lit + uVar36;
            if (0xffff < uVar36) {
              if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_001c9fa5:
                __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                              ,0x2b2,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            uVar32 = *(ulong *)((long)src + 8);
            *puVar55 = *src;
            puVar55[1] = uVar32;
            pBVar39 = seqStore->lit;
            if (0x10 < uVar36) {
              if ((ulong)((long)(pBVar39 + 0x10) + (-0x10 - ((long)src + 0x10))) <
                  0xffffffffffffffe1) {
                uVar32 = *(ulong *)((long)src + 0x18);
                *(ulong *)(pBVar39 + 0x10) = *(ulong *)((long)src + 0x10);
                *(ulong *)(pBVar39 + 0x18) = uVar32;
                if (0x20 < (long)uVar36) {
                  lVar34 = 0;
                  do {
                    puVar5 = (undefined8 *)((long)src + lVar34 + 0x20);
                    uVar18 = puVar5[1];
                    pBVar4 = pBVar39 + lVar34 + 0x20;
                    *(undefined8 *)pBVar4 = *puVar5;
                    *(undefined8 *)(pBVar4 + 8) = uVar18;
                    puVar5 = (undefined8 *)((long)src + lVar34 + 0x30);
                    uVar18 = puVar5[1];
                    *(undefined8 *)(pBVar4 + 0x10) = *puVar5;
                    *(undefined8 *)(pBVar4 + 0x18) = uVar18;
                    lVar34 = lVar34 + 0x20;
                  } while (pBVar4 + 0x20 < pBVar39 + uVar36);
                }
                goto LAB_001c674e;
              }
LAB_001c9fc4:
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                            ,0xe9,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            seqStore->lit = pBVar39 + uVar36;
          }
          uVar32 = sVar24 + 4;
          psVar60 = seqStore->sequences;
          psVar60->litLength = (U16)uVar36;
          psVar60->offBase = 1;
          if (uVar32 < 3) {
LAB_001c9f0a:
            __assert_fail("matchLength >= MINMATCH",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,700,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          uVar36 = sVar24 + 1;
          if (0xffff < uVar36) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001c9f67;
LAB_001c7050:
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar60 - (long)seqStore->sequencesStart) >> 3);
          }
LAB_001c706f:
          src = (void *)(uVar32 + (long)puVar56);
          psVar60->mlBase = (U16)uVar36;
          psVar60 = psVar60 + 1;
          seqStore->sequences = psVar60;
          puVar55 = (ulong *)src;
          if (src <= puVar22) {
            uVar44 = UVar51 + 2;
            lVar34 = *(long *)(pBVar9 + uVar44);
            pUVar14[(ulong)(lVar34 * -0x30e44323485a9b9d) >> (bVar27 & 0x3f)] = uVar44;
            pUVar14[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar27 & 0x3f)] =
                 ((int)src + -2) - iVar41;
            pUVar15[(ulong)(lVar34 * -0x30e44323405a9d00) >> (bVar28 & 0x3f)] = uVar44;
            pUVar15[(ulong)(*(long *)((long)src + -1) * -0x30e44323405a9d00) >> (bVar28 & 0x3f)] =
                 ((int)src + -1) - iVar41;
            uVar44 = uVar42;
            do {
              uVar53 = uVar47;
              UVar29 = (int)src - iVar41;
              uVar35 = UVar29 - uVar44;
              pBVar39 = pBVar9;
              if (uVar35 < uVar17) {
                pBVar39 = pBVar11 + -uVar58;
              }
              puVar55 = (ulong *)src;
              uVar42 = uVar44;
              uVar47 = uVar53;
              if (((uVar17 - 1) - uVar35 < 3) || (*(int *)(pBVar39 + uVar35) != (int)*src)) break;
              puVar55 = iEnd;
              if (uVar35 < uVar17) {
                puVar55 = mEnd;
              }
              sVar24 = ZSTD_count_2segments
                                 ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar39 + uVar35) + 4),
                                  (BYTE *)iEnd,(BYTE *)puVar55,(BYTE *)iStart);
              if (seqStore->maxNbSeq <= (ulong)((long)psVar60 - (long)seqStore->sequencesStart >> 3)
                 ) goto LAB_001c9ecc;
              if (0x20000 < seqStore->maxNbLit) goto LAB_001c9eeb;
              puVar55 = (ulong *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < puVar55) goto LAB_001c9f29;
              if (iEnd < src) goto LAB_001c9f48;
              if (puVar23 < src) {
                ZSTD_safecopyLiterals((BYTE *)puVar55,(BYTE *)src,(BYTE *)src,(BYTE *)puVar23);
              }
              else {
                uVar32 = *(ulong *)((long)src + 8);
                *puVar55 = *src;
                puVar55[1] = uVar32;
              }
              psVar60 = seqStore->sequences;
              psVar60->litLength = 0;
              psVar60->offBase = 1;
              if (sVar24 + 4 < 3) goto LAB_001c9f0a;
              if (0xffff < sVar24 + 1) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001c9f67;
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar60 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar60->mlBase = (U16)(sVar24 + 1);
              psVar60 = psVar60 + 1;
              seqStore->sequences = psVar60;
              uVar32 = *src;
              pUVar15[uVar32 * -0x30e44323405a9d00 >> (bVar28 & 0x3f)] = UVar29;
              pUVar14[uVar32 * -0x30e44323485a9b9d >> (bVar27 & 0x3f)] = UVar29;
              src = (void *)((long)src + sVar24 + 4);
              puVar55 = (ulong *)src;
              uVar42 = uVar53;
              uVar47 = uVar44;
              uVar44 = uVar53;
            } while (src <= puVar22);
          }
        }
        local_14c = uVar47;
      } while (puVar55 < puVar22);
    }
  }
  else {
    if (uVar53 < uVar35) goto LAB_001ca021;
    if (ms->prefetchCDictTables != 0) {
      if (uVar31 < 0x3e) {
        uVar32 = 0;
        do {
          uVar32 = uVar32 + 0x40;
        } while (uVar32 < (ulong)(4L << (bVar25 & 0x3f)));
      }
      if (uVar47 < 0x3e) {
        uVar32 = 0;
        do {
          uVar32 = uVar32 + 0x40;
        } while (uVar32 < (ulong)(4L << (bVar26 & 0x3f)));
      }
    }
    if (uVar46 < local_14c) goto LAB_001ca040;
    puVar55 = (ulong *)((long)src + (ulong)(uVar46 == 0));
    if (uVar46 < uVar42) goto LAB_001ca05f;
    if (puVar55 < puVar22) {
      if ((((0x20 < uVar7) || (0x20 < uVar8)) || (0x20 < uVar44)) || (0x20 < uVar30))
      goto LAB_001ca002;
      bVar27 = 0x40 - cVar19;
      bVar28 = 0x20 - cVar20;
      puVar1 = (ulong *)((long)iEnd - 7);
      puVar2 = (ulong *)((long)iEnd - 3);
      puVar3 = (ulong *)((long)iEnd - 1);
      puVar23 = iEnd + -4;
      do {
        uVar32 = *puVar55;
        uVar43 = uVar32 * -0x30e44323485a9b9d >> (bVar27 & 0x3f);
        uVar31 = (int)uVar32 * -0x61c8864f;
        uVar47 = uVar31 >> (bVar28 & 0x1f);
        uVar40 = uVar32 * -0x30e44323485a9b9d >> (0x38 - bVar25 & 0x3f);
        uVar31 = uVar31 >> (0x18 - bVar26 & 0x1f);
        uVar44 = pUVar12[uVar40 >> 8];
        uVar35 = pUVar13[uVar31 >> 8];
        iVar54 = (int)puVar55;
        UVar51 = iVar54 - iVar41;
        uVar53 = pUVar14[uVar43];
        uVar36 = (ulong)uVar53;
        UVar29 = UVar51 + 1;
        uVar30 = UVar29 - local_14c;
        piVar59 = (int *)(pBVar9 + uVar30);
        if (uVar30 < uVar17) {
          piVar59 = (int *)(pBVar11 + (uVar30 - uVar57));
        }
        uVar52 = pUVar15[uVar47];
        pUVar15[uVar47] = UVar51;
        pUVar14[uVar43] = UVar51;
        uVar47 = local_14c;
        if (((uVar17 - 1) - uVar30 < 3) || (*piVar59 != *(int *)((long)puVar55 + 1))) {
          puVar56 = puVar55;
          if (uVar17 < uVar53) {
            puVar33 = (ulong *)(pBVar9 + uVar36);
            if (*puVar33 != uVar32) goto LAB_001c943e;
            puVar50 = puVar55 + 1;
            puVar38 = puVar33 + 1;
            puVar49 = puVar50;
            if (puVar50 < puVar1) {
              if (*puVar38 == *puVar50) {
                lVar34 = 0;
                do {
                  puVar38 = (ulong *)((long)puVar55 + lVar34 + 0x10);
                  if (puVar1 <= puVar38) {
                    puVar38 = (ulong *)(pBVar9 + lVar34 + uVar36 + 0x10);
                    puVar49 = (ulong *)((long)puVar55 + lVar34 + 0x10);
                    goto LAB_001c9876;
                  }
                  lVar21 = lVar34 + uVar36 + 0x10;
                  uVar32 = *puVar38;
                  lVar34 = lVar34 + 8;
                } while (*(ulong *)(pBVar9 + lVar21) == uVar32);
                uVar32 = uVar32 ^ *(ulong *)(pBVar9 + lVar21);
                uVar40 = 0;
                if (uVar32 != 0) {
                  for (; (uVar32 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                  }
                }
                uVar32 = (uVar40 >> 3 & 0x1fffffff) + lVar34;
              }
              else {
                uVar40 = *puVar50 ^ *puVar38;
                uVar32 = 0;
                if (uVar40 != 0) {
                  for (; (uVar40 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                  }
                }
                uVar32 = uVar32 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_001c9876:
              if ((puVar49 < puVar2) && ((int)*puVar38 == (int)*puVar49)) {
                puVar49 = (ulong *)((long)puVar49 + 4);
                puVar38 = (ulong *)((long)puVar38 + 4);
              }
              if ((puVar49 < puVar3) && ((short)*puVar38 == (short)*puVar49)) {
                puVar49 = (ulong *)((long)puVar49 + 2);
                puVar38 = (ulong *)((long)puVar38 + 2);
              }
              if (puVar49 < iEnd) {
                puVar49 = (ulong *)((long)puVar49 + (ulong)((BYTE)*puVar38 == (BYTE)*puVar49));
              }
              uVar32 = (long)puVar49 - (long)puVar50;
            }
            uVar32 = uVar32 + 8;
            uVar47 = iVar54 - (int)puVar33;
            if (puVar55 <= src) goto LAB_001c9add;
            piVar59 = (int *)(pBVar9 + (uVar36 - 1));
            puVar56 = (ulong *)((long)puVar55 + -1);
            do {
              if ((char)*puVar56 != (char)*piVar59) goto LAB_001c9ad2;
              uVar32 = uVar32 + 1;
              puVar55 = (ulong *)((long)puVar56 + -1);
            } while ((src < puVar56) &&
                    (bVar16 = iStart < piVar59, piVar59 = (int *)((long)piVar59 + -1),
                    puVar56 = puVar55, bVar16));
            goto LAB_001c9a1c;
          }
          if ((char)uVar40 == (char)uVar44) {
            uVar44 = uVar44 >> 8;
            puVar33 = (ulong *)(pBVar11 + uVar44);
            if (puVar33 < mEnd) {
              if ((uVar44 <= uVar6) || (*puVar33 != uVar32)) goto LAB_001c943e;
              sVar24 = ZSTD_count_2segments
                                 ((BYTE *)(puVar55 + 1),(BYTE *)(puVar33 + 1),(BYTE *)iEnd,
                                  (BYTE *)mEnd,(BYTE *)iStart);
              uVar32 = sVar24 + 8;
              uVar47 = UVar51 - (uVar44 + uVar57);
              if (src < puVar55) {
                piVar59 = (int *)(pBVar11 + ((ulong)uVar44 - 1));
                puVar56 = (ulong *)((long)puVar55 + -1);
                do {
                  if ((char)*puVar56 != (char)*piVar59) goto LAB_001c9ad2;
                  uVar32 = uVar32 + 1;
                  puVar55 = (ulong *)((long)puVar56 + -1);
                } while ((src < puVar56) &&
                        (bVar16 = piVar37 < piVar59, piVar59 = (int *)((long)piVar59 + -1),
                        puVar56 = puVar55, bVar16));
                goto LAB_001c9a1c;
              }
              goto LAB_001c9add;
            }
            goto LAB_001c9fe3;
          }
LAB_001c943e:
          if (uVar17 < uVar52) {
            piVar59 = (int *)(pBVar9 + uVar52);
            if (*piVar59 != (int)*puVar55) goto LAB_001c9591;
LAB_001c9464:
            uVar32 = *(ulong *)((long)puVar55 + 1);
            uVar43 = uVar32 * -0x30e44323485a9b9d >> (bVar27 & 0x3f);
            uVar40 = uVar32 * -0x30e44323485a9b9d >> (0x38 - bVar25 & 0x3f);
            puVar56 = (ulong *)((long)puVar55 + 1);
            uVar44 = pUVar14[uVar43];
            uVar36 = (ulong)uVar44;
            uVar35 = pUVar12[uVar40 >> 8];
            pUVar14[uVar43] = UVar29;
            if (uVar17 < uVar44) {
              puVar33 = (ulong *)(pBVar9 + uVar36);
              if (*puVar33 != uVar32) goto LAB_001c96fa;
              puVar49 = (ulong *)((long)puVar55 + 9);
              puVar50 = puVar33 + 1;
              puVar38 = puVar49;
              if (puVar49 < puVar1) {
                if (*puVar50 == *puVar49) {
                  lVar34 = 0;
                  do {
                    puVar50 = (ulong *)((long)puVar55 + lVar34 + 0x11);
                    if (puVar1 <= puVar50) {
                      puVar50 = (ulong *)(pBVar9 + lVar34 + uVar36 + 0x10);
                      puVar38 = (ulong *)((long)puVar55 + lVar34 + 0x11);
                      goto LAB_001c9a37;
                    }
                    lVar21 = lVar34 + uVar36 + 0x10;
                    uVar32 = *puVar50;
                    lVar34 = lVar34 + 8;
                  } while (*(ulong *)(pBVar9 + lVar21) == uVar32);
                  uVar32 = uVar32 ^ *(ulong *)(pBVar9 + lVar21);
                  uVar40 = 0;
                  if (uVar32 != 0) {
                    for (; (uVar32 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                    }
                  }
                  uVar32 = (uVar40 >> 3 & 0x1fffffff) + lVar34;
                }
                else {
                  uVar40 = *puVar49 ^ *puVar50;
                  uVar32 = 0;
                  if (uVar40 != 0) {
                    for (; (uVar40 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                    }
                  }
                  uVar32 = uVar32 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_001c9a37:
                if ((puVar38 < puVar2) && ((int)*puVar50 == (int)*puVar38)) {
                  puVar38 = (ulong *)((long)puVar38 + 4);
                  puVar50 = (ulong *)((long)puVar50 + 4);
                }
                if ((puVar38 < puVar3) && ((short)*puVar50 == (short)*puVar38)) {
                  puVar38 = (ulong *)((long)puVar38 + 2);
                  puVar50 = (ulong *)((long)puVar50 + 2);
                }
                if (puVar38 < iEnd) {
                  puVar38 = (ulong *)((long)puVar38 + (ulong)((BYTE)*puVar50 == (BYTE)*puVar38));
                }
                uVar32 = (long)puVar38 - (long)puVar49;
              }
              uVar32 = uVar32 + 8;
              uVar47 = (int)puVar56 - (int)puVar33;
              if (src < puVar56) {
                piVar59 = (int *)(pBVar9 + (uVar36 - 1));
                do {
                  if ((char)*puVar55 != (char)*piVar59) goto LAB_001c9a1c;
                  uVar32 = uVar32 + 1;
                  puVar56 = (ulong *)((long)puVar55 + -1);
                } while ((src < puVar55) &&
                        (bVar16 = iStart < piVar59, piVar59 = (int *)((long)piVar59 + -1),
                        puVar55 = puVar56, bVar16));
LAB_001c9ad2:
                puVar56 = (ulong *)((long)puVar56 + 1);
              }
            }
            else {
              if ((char)uVar40 == (char)uVar35) {
                uVar35 = uVar35 >> 8;
                puVar33 = (ulong *)(pBVar11 + uVar35);
                if (mEnd <= puVar33) goto LAB_001ca07e;
                if ((uVar6 < uVar35) && (*puVar33 == uVar32)) {
                  sVar24 = ZSTD_count_2segments
                                     ((BYTE *)((long)puVar55 + 9),(BYTE *)(puVar33 + 1),(BYTE *)iEnd
                                      ,(BYTE *)mEnd,(BYTE *)iStart);
                  uVar32 = sVar24 + 8;
                  uVar47 = UVar29 - (uVar57 + uVar35);
                  if (src < puVar56) {
                    piVar59 = (int *)(pBVar11 + ((ulong)uVar35 - 1));
                    do {
                      if ((char)*puVar55 != (char)*piVar59) goto LAB_001c9a1c;
                      uVar32 = uVar32 + 1;
                      puVar56 = (ulong *)((long)puVar55 + -1);
                    } while ((src < puVar55) &&
                            (bVar16 = piVar37 < piVar59, piVar59 = (int *)((long)piVar59 + -1),
                            puVar55 = puVar56, bVar16));
LAB_001c96ef:
                    puVar56 = (ulong *)((long)puVar56 + 1);
                  }
                  goto LAB_001c9add;
                }
              }
LAB_001c96fa:
              puVar56 = (ulong *)((long)puVar55 + 4);
              puVar33 = (ulong *)(piVar59 + 1);
              if (uVar52 < uVar17) {
                sVar24 = ZSTD_count_2segments
                                   ((BYTE *)puVar56,(BYTE *)puVar33,(BYTE *)iEnd,(BYTE *)mEnd,
                                    (BYTE *)iStart);
                uVar32 = sVar24 + 4;
                uVar47 = UVar51 - uVar52;
                puVar56 = puVar55;
                if ((src < puVar55) && (piVar37 < piVar59)) {
                  puVar56 = (ulong *)((long)puVar55 + -1);
                  do {
                    piVar59 = (int *)((long)piVar59 + -1);
                    if ((char)*puVar56 != *(char *)piVar59) goto LAB_001c96ef;
                    uVar32 = uVar32 + 1;
                    puVar55 = (ulong *)((long)puVar56 + -1);
                  } while ((src < puVar56) && (puVar56 = puVar55, piVar37 < piVar59));
LAB_001c9a1c:
                  puVar56 = (ulong *)((long)puVar55 + 1);
                }
              }
              else {
                puVar50 = puVar56;
                if (puVar56 < puVar1) {
                  if (*puVar33 == *puVar56) {
                    lVar34 = 0;
                    do {
                      puVar33 = (ulong *)((long)puVar55 + lVar34 + 0xc);
                      if (puVar1 <= puVar33) {
                        puVar33 = (ulong *)((long)piVar59 + lVar34 + 0xc);
                        puVar50 = (ulong *)((long)puVar55 + lVar34 + 0xc);
                        goto LAB_001c997a;
                      }
                      uVar32 = *(ulong *)((long)piVar59 + lVar34 + 0xc);
                      uVar36 = *puVar33;
                      lVar34 = lVar34 + 8;
                    } while (uVar32 == uVar36);
                    uVar36 = uVar36 ^ uVar32;
                    uVar32 = 0;
                    if (uVar36 != 0) {
                      for (; (uVar36 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                      }
                    }
                    uVar32 = (uVar32 >> 3 & 0x1fffffff) + lVar34;
                  }
                  else {
                    uVar36 = *puVar56 ^ *puVar33;
                    uVar32 = 0;
                    if (uVar36 != 0) {
                      for (; (uVar36 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                      }
                    }
                    uVar32 = uVar32 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_001c997a:
                  if ((puVar50 < puVar2) && ((int)*puVar33 == (int)*puVar50)) {
                    puVar50 = (ulong *)((long)puVar50 + 4);
                    puVar33 = (ulong *)((long)puVar33 + 4);
                  }
                  if ((puVar50 < puVar3) && ((short)*puVar33 == (short)*puVar50)) {
                    puVar50 = (ulong *)((long)puVar50 + 2);
                    puVar33 = (ulong *)((long)puVar33 + 2);
                  }
                  if (puVar50 < iEnd) {
                    puVar50 = (ulong *)((long)puVar50 + (ulong)((BYTE)*puVar33 == (BYTE)*puVar50));
                  }
                  uVar32 = (long)puVar50 - (long)puVar56;
                }
                uVar32 = uVar32 + 4;
                uVar47 = iVar54 - (int)piVar59;
                puVar56 = puVar55;
                if ((src < puVar55) && (iStart < piVar59)) {
                  puVar56 = (ulong *)((long)puVar55 + -1);
                  do {
                    piVar59 = (int *)((long)piVar59 + -1);
                    if ((char)*puVar56 != *(char *)piVar59) goto LAB_001c96ef;
                    uVar32 = uVar32 + 1;
                    puVar55 = (ulong *)((long)puVar56 + -1);
                  } while ((src < puVar56) && (puVar56 = puVar55, iStart < piVar59));
                  goto LAB_001c9a1c;
                }
              }
            }
LAB_001c9add:
            if (uVar47 != 0) {
              if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                  seqStore->maxNbSeq) {
                if (seqStore->maxNbLit < 0x20001) {
                  uVar36 = (long)puVar56 - (long)src;
                  puVar55 = (ulong *)seqStore->lit;
                  if ((BYTE *)((long)puVar55 + uVar36) <= seqStore->litStart + seqStore->maxNbLit) {
                    if (puVar56 <= iEnd) {
                      if (puVar23 < puVar56) {
                        ZSTD_safecopyLiterals
                                  ((BYTE *)puVar55,(BYTE *)src,(BYTE *)puVar56,(BYTE *)puVar23);
LAB_001c9b55:
                        seqStore->lit = seqStore->lit + uVar36;
                        if (0xffff < uVar36) {
                          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001c9fa5;
                          seqStore->longLengthType = ZSTD_llt_literalLength;
                          seqStore->longLengthPos =
                               (U32)((ulong)((long)seqStore->sequences -
                                            (long)seqStore->sequencesStart) >> 3);
                        }
                      }
                      else {
                        uVar40 = *(ulong *)((long)src + 8);
                        *puVar55 = *src;
                        puVar55[1] = uVar40;
                        pBVar39 = seqStore->lit;
                        if (0x10 < uVar36) {
                          if ((ulong)((long)(pBVar39 + 0x10) + (-0x10 - ((long)src + 0x10))) <
                              0xffffffffffffffe1) {
                            uVar40 = *(ulong *)((long)src + 0x18);
                            *(ulong *)(pBVar39 + 0x10) = *(ulong *)((long)src + 0x10);
                            *(ulong *)(pBVar39 + 0x18) = uVar40;
                            if (0x20 < (long)uVar36) {
                              lVar34 = 0;
                              do {
                                puVar5 = (undefined8 *)((long)src + lVar34 + 0x20);
                                uVar18 = puVar5[1];
                                pBVar4 = pBVar39 + lVar34 + 0x20;
                                *(undefined8 *)pBVar4 = *puVar5;
                                *(undefined8 *)(pBVar4 + 8) = uVar18;
                                puVar5 = (undefined8 *)((long)src + lVar34 + 0x30);
                                uVar18 = puVar5[1];
                                *(undefined8 *)(pBVar4 + 0x10) = *puVar5;
                                *(undefined8 *)(pBVar4 + 0x18) = uVar18;
                                lVar34 = lVar34 + 0x20;
                              } while (pBVar4 + 0x20 < pBVar39 + uVar36);
                            }
                            goto LAB_001c9b55;
                          }
                          goto LAB_001c9fc4;
                        }
                        seqStore->lit = pBVar39 + uVar36;
                      }
                      psVar60 = seqStore->sequences;
                      psVar60->litLength = (U16)uVar36;
                      psVar60->offBase = uVar47 + 3;
                      if (uVar32 < 3) goto LAB_001c9f0a;
                      uVar36 = uVar32 - 3;
                      uVar42 = local_14c;
                      if (uVar36 < 0x10000) goto LAB_001c9c5e;
                      if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_001c9c3a;
                      goto LAB_001c9f67;
                    }
                    goto LAB_001c9f48;
                  }
                  goto LAB_001c9f29;
                }
                goto LAB_001c9eeb;
              }
              goto LAB_001c9ecc;
            }
            goto LAB_001c9f86;
          }
          if ((char)uVar31 == (char)uVar35) {
            uVar35 = uVar35 >> 8;
            if ((uVar6 < uVar35) && (*(int *)(pBVar11 + uVar35) == (int)*puVar55)) {
              uVar52 = uVar35 + uVar57;
              piVar59 = (int *)(pBVar11 + uVar35);
              goto LAB_001c9464;
            }
          }
LAB_001c9591:
          puVar55 = (ulong *)((long)puVar55 + ((long)puVar55 - (long)src >> 8) + 1);
        }
        else {
          puVar56 = iEnd;
          if (uVar30 < uVar17) {
            puVar56 = mEnd;
          }
          sVar24 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar55 + 5),(BYTE *)(piVar59 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar56,(BYTE *)iStart);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_001c9ecc;
          if (0x20000 < seqStore->maxNbLit) goto LAB_001c9eeb;
          puVar56 = (ulong *)((long)puVar55 + 1);
          uVar36 = (long)puVar56 - (long)src;
          puVar55 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar55 + uVar36))
          goto LAB_001c9f29;
          if (iEnd < puVar56) goto LAB_001c9f48;
          if (puVar23 < puVar56) {
            ZSTD_safecopyLiterals((BYTE *)puVar55,(BYTE *)src,(BYTE *)puVar56,(BYTE *)puVar23);
LAB_001c92a7:
            seqStore->lit = seqStore->lit + uVar36;
            if (0xffff < uVar36) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001c9fa5;
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            uVar32 = *(ulong *)((long)src + 8);
            *puVar55 = *src;
            puVar55[1] = uVar32;
            pBVar39 = seqStore->lit;
            if (0x10 < uVar36) {
              if ((ulong)((long)(pBVar39 + 0x10) + (-0x10 - ((long)src + 0x10))) <
                  0xffffffffffffffe1) {
                uVar32 = *(ulong *)((long)src + 0x18);
                *(ulong *)(pBVar39 + 0x10) = *(ulong *)((long)src + 0x10);
                *(ulong *)(pBVar39 + 0x18) = uVar32;
                if (0x20 < (long)uVar36) {
                  lVar34 = 0;
                  do {
                    puVar5 = (undefined8 *)((long)src + lVar34 + 0x20);
                    uVar18 = puVar5[1];
                    pBVar4 = pBVar39 + lVar34 + 0x20;
                    *(undefined8 *)pBVar4 = *puVar5;
                    *(undefined8 *)(pBVar4 + 8) = uVar18;
                    puVar5 = (undefined8 *)((long)src + lVar34 + 0x30);
                    uVar18 = puVar5[1];
                    *(undefined8 *)(pBVar4 + 0x10) = *puVar5;
                    *(undefined8 *)(pBVar4 + 0x18) = uVar18;
                    lVar34 = lVar34 + 0x20;
                  } while (pBVar4 + 0x20 < pBVar39 + uVar36);
                }
                goto LAB_001c92a7;
              }
              goto LAB_001c9fc4;
            }
            seqStore->lit = pBVar39 + uVar36;
          }
          uVar32 = sVar24 + 4;
          psVar60 = seqStore->sequences;
          psVar60->litLength = (U16)uVar36;
          psVar60->offBase = 1;
          if (uVar32 < 3) goto LAB_001c9f0a;
          uVar36 = sVar24 + 1;
          if (0xffff < uVar36) {
            local_14c = uVar42;
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001c9f67;
LAB_001c9c3a:
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar60 - (long)seqStore->sequencesStart) >> 3);
            uVar42 = local_14c;
          }
LAB_001c9c5e:
          src = (void *)(uVar32 + (long)puVar56);
          psVar60->mlBase = (U16)uVar36;
          psVar60 = psVar60 + 1;
          seqStore->sequences = psVar60;
          puVar55 = (ulong *)src;
          if (src <= puVar22) {
            uVar44 = UVar51 + 2;
            pUVar14[(ulong)(*(long *)(pBVar9 + uVar44) * -0x30e44323485a9b9d) >> (bVar27 & 0x3f)] =
                 uVar44;
            pUVar14[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar27 & 0x3f)] =
                 ((int)src + -2) - iVar41;
            pUVar15[(uint)(*(int *)(pBVar9 + uVar44) * -0x61c8864f) >> (bVar28 & 0x1f)] = uVar44;
            pUVar15[(uint)(*(int *)((long)src + -1) * -0x61c8864f) >> (bVar28 & 0x1f)] =
                 ((int)src + -1) - iVar41;
            uVar44 = uVar42;
            do {
              uVar53 = uVar47;
              UVar29 = (int)src - iVar41;
              uVar35 = UVar29 - uVar44;
              pBVar39 = pBVar9;
              if (uVar35 < uVar17) {
                pBVar39 = pBVar11 + -uVar58;
              }
              puVar55 = (ulong *)src;
              uVar42 = uVar44;
              uVar47 = uVar53;
              if (((uVar17 - 1) - uVar35 < 3) || (*(int *)(pBVar39 + uVar35) != (int)*src)) break;
              puVar55 = iEnd;
              if (uVar35 < uVar17) {
                puVar55 = mEnd;
              }
              sVar24 = ZSTD_count_2segments
                                 ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar39 + uVar35) + 4),
                                  (BYTE *)iEnd,(BYTE *)puVar55,(BYTE *)iStart);
              if (seqStore->maxNbSeq <= (ulong)((long)psVar60 - (long)seqStore->sequencesStart >> 3)
                 ) goto LAB_001c9ecc;
              if (0x20000 < seqStore->maxNbLit) goto LAB_001c9eeb;
              puVar55 = (ulong *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < puVar55) goto LAB_001c9f29;
              if (iEnd < src) goto LAB_001c9f48;
              if (puVar23 < src) {
                ZSTD_safecopyLiterals((BYTE *)puVar55,(BYTE *)src,(BYTE *)src,(BYTE *)puVar23);
              }
              else {
                uVar32 = *(ulong *)((long)src + 8);
                *puVar55 = *src;
                puVar55[1] = uVar32;
              }
              psVar60 = seqStore->sequences;
              psVar60->litLength = 0;
              psVar60->offBase = 1;
              if (sVar24 + 4 < 3) goto LAB_001c9f0a;
              if (0xffff < sVar24 + 1) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001c9f67;
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar60 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar60->mlBase = (U16)(sVar24 + 1);
              psVar60 = psVar60 + 1;
              seqStore->sequences = psVar60;
              pUVar15[(uint)((int)*src * -0x61c8864f) >> (bVar28 & 0x1f)] = UVar29;
              pUVar14[*src * -0x30e44323485a9b9d >> (bVar27 & 0x3f)] = UVar29;
              src = (void *)((long)src + sVar24 + 4);
              puVar55 = (ulong *)src;
              uVar42 = uVar53;
              uVar47 = uVar44;
              uVar44 = uVar53;
            } while (src <= puVar22);
          }
        }
        local_14c = uVar47;
      } while (puVar55 < puVar22);
    }
  }
  *rep = local_14c;
  rep[1] = uVar42;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_4(ms, seqStore, rep, src, srcSize);
    case 5 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_5(ms, seqStore, rep, src, srcSize);
    case 6 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_6(ms, seqStore, rep, src, srcSize);
    case 7 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_7(ms, seqStore, rep, src, srcSize);
    }
}